

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_modinv32_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  int64_t *piVar1;
  uint *puVar2;
  ushort *puVar3;
  secp256k1_scalar *a;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int64_t iVar11;
  int64_t iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar16;
  uint64_t uVar17;
  long lVar18;
  byte bVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  secp256k1_modinv64_modinfo *m_00;
  secp256k1_modinv64_modinfo *psVar23;
  long lVar24;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar25;
  long lVar26;
  secp256k1_modinv32_signed30 *b_00;
  long *extraout_RDX_01;
  char cVar27;
  uint uVar28;
  uint uVar29;
  uint16_t *puVar30;
  long lVar31;
  secp256k1_modinv64_modinfo *psVar33;
  secp256k1_modinv64_modinfo *psVar34;
  int *piVar35;
  secp256k1_modinv32_signed30 *psVar36;
  ulong unaff_RBP;
  uint64_t uVar37;
  ulong uVar38;
  secp256k1_modinv32_signed30 *psVar39;
  secp256k1_fe *psVar40;
  ulong uVar41;
  secp256k1_fe *r;
  uint uVar42;
  uint uVar43;
  secp256k1_modinv64_modinfo *psVar44;
  secp256k1_modinv64_modinfo *psVar45;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar46;
  ulong uVar47;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar48;
  uchar *__s;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  int iVar52;
  ulong uVar53;
  secp256k1_modinv64_modinfo *psVar54;
  int *piVar55;
  uint uVar56;
  secp256k1_modinv64_modinfo *psVar57;
  secp256k1_modinv64_modinfo *psVar58;
  secp256k1_modinv32_signed30 *psVar59;
  uint uVar60;
  uint uVar61;
  code *pcVar62;
  secp256k1_modinv64_modinfo *psVar63;
  secp256k1_modinv32_signed30 *psVar64;
  size_t count;
  uint uVar65;
  uint64_t uVar66;
  secp256k1_fe *a_03;
  uint uVar67;
  uint uVar68;
  uint64_t uVar69;
  bool bVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  secp256k1_modinv32_signed30 x;
  secp256k1_modinv32_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  ulong uStack_1820;
  secp256k1_fe *psStack_1818;
  uchar auStack_1810 [4232];
  secp256k1_fe *psStack_788;
  ulong uStack_780;
  uint64_t uStack_778;
  secp256k1_fe *psStack_770;
  code *pcStack_768;
  code *pcStack_760;
  undefined1 auStack_758 [36];
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  int iStack_728;
  int iStack_724;
  int iStack_720;
  int iStack_71c;
  undefined1 auStack_718 [48];
  code *pcStack_6e8;
  long lStack_6d8;
  secp256k1_fe sStack_6d0;
  secp256k1_fe *psStack_698;
  secp256k1_fe sStack_690;
  secp256k1_fe sStack_660;
  ulong uStack_628;
  ulong uStack_620;
  ulong uStack_618;
  secp256k1_modinv32_signed30 *psStack_610;
  ulong uStack_608;
  code *pcStack_600;
  uint uStack_5f8;
  uint uStack_5f4;
  uint uStack_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  secp256k1_modinv32_signed30 *psStack_5e0;
  uint uStack_5d4;
  uint uStack_5d0;
  uint uStack_5cc;
  uint uStack_5c8;
  int32_t iStack_5c4;
  secp256k1_modinv32_signed30 *psStack_5c0;
  secp256k1_modinv32_signed30 *psStack_5b8;
  secp256k1_modinv32_signed30 *psStack_5b0;
  secp256k1_modinv32_signed30 *psStack_5a8;
  secp256k1_modinv32_signed30 *psStack_5a0;
  code *pcStack_598;
  long lStack_588;
  long lStack_580;
  int *piStack_578;
  ulong uStack_570;
  secp256k1_modinv64_modinfo *psStack_568;
  secp256k1_modinv64_modinfo *psStack_558;
  code *pcStack_550;
  secp256k1_modinv32_signed30 *psStack_548;
  int *piStack_538;
  ulong uStack_530;
  secp256k1_modinv64_modinfo *psStack_528;
  secp256k1_modinv64_modinfo *psStack_518;
  code *pcStack_510;
  secp256k1_modinv32_signed30 sStack_508;
  secp256k1_modinv32_signed30 sStack_4e4;
  secp256k1_modinv64_modinfo *psStack_4c0;
  secp256k1_modinv64_modinfo *psStack_4b8;
  secp256k1_modinv64_modinfo *psStack_4a8;
  int iStack_49c;
  uint uStack_498;
  uint uStack_494;
  secp256k1_modinv32_trans2x2 sStack_490;
  secp256k1_modinv64_modinfo sStack_480;
  long lStack_450;
  undefined8 uStack_448;
  secp256k1_modinv64_modinfo sStack_440;
  undefined1 auStack_410 [40];
  uint64_t uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  secp256k1_modinv64_modinfo *psStack_3c8;
  ulong uStack_3c0;
  secp256k1_modinv64_modinfo *psStack_3b8;
  secp256k1_modinv64_modinfo *psStack_3b0;
  secp256k1_modinv64_modinfo *psStack_3a8;
  secp256k1_modinv64_modinfo *psStack_3a0;
  int iStack_394;
  secp256k1_modinv64_modinfo *psStack_390;
  secp256k1_modinv32_trans2x2 sStack_388;
  secp256k1_modinv64_modinfo sStack_378;
  secp256k1_modinv64_modinfo *psStack_348;
  undefined8 uStack_340;
  secp256k1_modinv64_modinfo sStack_338;
  undefined1 auStack_308 [40];
  uint64_t uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  secp256k1_modinv64_modinfo *psStack_2c0;
  secp256k1_modinv64_modinfo *psStack_2b8;
  secp256k1_modinv64_modinfo *psStack_2b0;
  secp256k1_modinv64_modinfo *psStack_2a8;
  secp256k1_modinv64_modinfo *psStack_2a0;
  code *pcStack_298;
  secp256k1_modinv64_modinfo *psStack_290;
  int iStack_288;
  uint uStack_284;
  secp256k1_modinv32_trans2x2 sStack_280;
  secp256k1_modinv64_modinfo sStack_270;
  secp256k1_modinv64_modinfo sStack_240;
  secp256k1_modinv64_modinfo *psStack_210;
  secp256k1_modinv64_modinfo *psStack_208;
  secp256k1_modinv64_modinfo *psStack_200;
  secp256k1_modinv64_modinfo *psStack_1f8;
  secp256k1_modinv64_modinfo *psStack_1f0;
  secp256k1_modinv64_modinfo *psStack_1e8;
  code *pcStack_1e0;
  code *pcStack_1d8;
  secp256k1_modinv64_modinfo sStack_1d0;
  secp256k1_modinv64_modinfo sStack_1a0;
  secp256k1_modinv64_modinfo sStack_170;
  uint16_t uStack_140;
  undefined8 uStack_13e;
  undefined6 uStack_136;
  undefined2 uStack_130;
  undefined6 uStack_12e;
  int64_t iStack_128;
  uint16_t *puStack_118;
  ulong uStack_110;
  code *pcStack_108;
  uint16_t *puStack_100;
  uint16_t *puStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv64_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  secp256k1_modinv64_modinfo *psVar32;
  
  psVar63 = &local_e8;
  psVar45 = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar13 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar13 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((in[uVar13 >> 4] >> (uVar13 & 0xf) & 1) != 0) <<
                        ((char)(uVar13 / 0x1e) * -0x1e + (char)uVar13 & 0x1fU);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x100);
  uVar60 = local_e8.modulus.v[0]._4_4_ | (uint)local_e8.modulus.v[0] | (uint)local_e8.modulus.v[1] |
           local_e8.modulus.v[1]._4_4_ | (uint)local_e8.modulus.v[2] | local_e8.modulus.v[2]._4_4_ |
           (uint)local_e8.modulus.v[3] | local_e8.modulus.v[3]._4_4_ | (uint)local_e8.modulus.v[4];
  pcVar62 = (code *)(ulong)uVar60;
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4]._0_4_ = 0;
  uVar13 = 0;
  do {
    psVar34 = (secp256k1_modinv64_modinfo *)(ulong)mod[uVar13 >> 4];
    puVar2 = (uint *)((long)local_b8.modulus.v + (ulong)((uVar13 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((mod[uVar13 >> 4] >> (uVar13 & 0xf) & 1) != 0) <<
                        ((char)(uVar13 / 0x1e) * -0x1e + (char)uVar13 & 0x1fU);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x100);
  iVar14 = (int)local_b8.modulus.v[0];
  psVar57 = (secp256k1_modinv64_modinfo *)(long)(int)local_b8.modulus.v[0];
  pcStack_f0 = (code *)0x149f56;
  uVar17 = modinv2p64((uint64_t)psVar57);
  local_b8.modulus.v[4]._4_4_ = (uint)uVar17 & 0x3fffffff;
  uVar13 = iVar14 * (uint)uVar17 & 0x3fffffff;
  uVar49 = (ulong)uVar13;
  puVar30 = mod;
  if (uVar13 != 1) goto LAB_0014a332;
  if (uVar60 == 0) {
LAB_0014a0b8:
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4]._0_4_ = 0;
    uVar13 = 0;
    do {
      puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar13 & 0xff) / 0x1e) * 4);
      *puVar2 = *puVar2 | (uint)((in[uVar13 >> 4] >> (uVar13 & 0xf) & 1) != 0) <<
                          ((char)(uVar13 / 0x1e) * -0x1e + (char)uVar13 & 0x1fU);
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x100);
    iVar14 = 0x10;
    do {
      uVar49 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
               >> 0x3d;
      iVar21 = *(int *)((long)local_b8.modulus.v + uVar49 * 4);
      if (iVar21 < 1) {
        if ((iVar21 < 0) &&
           (iVar52 = *(int *)((long)local_b8.modulus.v + uVar49 * 4 + 4), 0x3ffffffe < iVar52)) {
          *(int *)((long)local_b8.modulus.v + uVar49 * 4) = iVar21 + 0x40000000;
          iVar52 = iVar52 + -1;
          goto LAB_0014a16e;
        }
      }
      else {
        iVar52 = *(int *)((long)local_b8.modulus.v + uVar49 * 4 + 4);
        if (iVar52 < 0x40000000) {
          *(int *)((long)local_b8.modulus.v + uVar49 * 4) = iVar21 + -0x40000000;
          iVar52 = iVar52 + 1;
LAB_0014a16e:
          *(int *)((long)local_b8.modulus.v + uVar49 * 4 + 4) = iVar52;
        }
      }
      uVar50 = secp256k1_test_state[1] << 0x11;
      uVar38 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar49 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar38;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar49;
      secp256k1_test_state[2] = uVar38 ^ uVar50;
      secp256k1_test_state[3] = uVar49 << 0x2d | uVar49 >> 0x13;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    unaff_RBP = (ulong)(uVar60 != 0);
    puVar30 = (uint16_t *)CONCAT71((int7)((ulong)mod >> 8),1);
    uVar49 = 0x88888889;
    local_88.modulus_inv62 = (uint64_t)mod;
    while( true ) {
      cVar27 = (char)puVar30;
      pcVar62 = secp256k1_modinv32_var;
      if (cVar27 != '\0') {
        pcVar62 = secp256k1_modinv32;
      }
      pcStack_f0 = (code *)0x14a209;
      (*pcVar62)(&local_e8,&local_b8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar13 = 0;
      do {
        out[uVar13 >> 4] =
             out[uVar13 >> 4] |
             (ushort)((*(uint *)((long)local_e8.modulus.v + (ulong)((uVar13 & 0xff) / 0x1e) * 4) >>
                       uVar13 % 0x1e & 1) != 0) << ((byte)uVar13 & 0xf);
        uVar13 = uVar13 + 1;
      } while (uVar13 != 0x100);
      psVar57 = &local_88;
      pcStack_f0 = (code *)0x14a26e;
      psVar34 = (secp256k1_modinv64_modinfo *)out;
      mulmod256((uint16_t *)psVar57,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((ushort)local_88.modulus.v[0] != (uVar60 != 0)) break;
      lVar18 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar18 * 2) != 0) {
          pcStack_f0 = (code *)0x14a328;
          test_modinv32_uint16_cold_4();
          goto LAB_0014a328;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      pcStack_f0 = (code *)0x14a29e;
      (*pcVar62)(&local_e8,&local_b8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      uVar13 = 0;
      do {
        uVar42 = *(uint *)((long)local_e8.modulus.v + (ulong)((uVar13 & 0xff) / 0x1e) * 4);
        psVar34 = (secp256k1_modinv64_modinfo *)(ulong)uVar42;
        uVar42 = (uint)((uVar42 >> uVar13 % 0x1e & 1) != 0) << ((byte)uVar13 & 0xf);
        psVar57 = (secp256k1_modinv64_modinfo *)(ulong)uVar42;
        puVar3 = (ushort *)((long)local_88.modulus.v + (ulong)(uVar13 >> 4) * 2);
        *puVar3 = *puVar3 | (ushort)uVar42;
        uVar13 = uVar13 + 1;
      } while (uVar13 != 0x100);
      lVar18 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar18 * 2) != in[lVar18]) goto LAB_0014a328;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      puVar30 = (uint16_t *)0x0;
      if (cVar27 == '\0') {
        return;
      }
    }
    goto LAB_0014a32d;
  }
  pcStack_f0 = (code *)0x149f8e;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar13 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar13 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar13 >> 4) * 2) >>
                                (uVar13 & 0xf) & 1) != 0) <<
                        ((char)(uVar13 / 0x1e) * -0x1e + (char)uVar13 & 0x1fU);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x100);
  psVar34 = &local_b8;
  pcStack_f0 = (code *)0x149ffa;
  uVar13 = secp256k1_jacobi32_maybe_var
                     ((secp256k1_modinv32_signed30 *)&local_e8,(secp256k1_modinv32_modinfo *)psVar34
                     );
  if (1 < uVar13) goto LAB_0014a337;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x14a033;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar13 = 0;
  do {
    puVar2 = (uint *)((long)local_e8.modulus.v + (ulong)((uVar13 & 0xff) / 0x1e) * 4);
    *puVar2 = *puVar2 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar13 >> 4) * 2) >>
                                (uVar13 & 0xf) & 1) != 0) <<
                        ((char)(uVar13 / 0x1e) * -0x1e + (char)uVar13 & 0x1fU);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x100);
  psVar34 = &local_b8;
  pcStack_f0 = (code *)0x14a09f;
  iVar14 = secp256k1_jacobi32_maybe_var
                     ((secp256k1_modinv32_signed30 *)&local_e8,(secp256k1_modinv32_modinfo *)psVar34
                     );
  if ((iVar14 == 0) || (iVar14 == 1 - (*mod & 2))) goto LAB_0014a0b8;
LAB_0014a33c:
  pcStack_f0 = test_modinv64_uint16;
  test_modinv32_uint16_cold_2();
  pcStack_f0 = (code *)unaff_RBP;
  puStack_f8 = out;
  puStack_100 = in;
  pcStack_108 = pcVar62;
  uStack_110 = uVar49;
  puStack_118 = puVar30;
  psVar57 = &sStack_1d0;
  psVar63 = &sStack_1d0;
  sStack_1d0.modulus.v[0] = 0;
  sStack_1d0.modulus.v[1] = 0;
  sStack_1d0.modulus.v[2] = 0;
  sStack_1d0.modulus.v[3] = 0;
  sStack_1d0.modulus.v[4] = 0;
  uVar38 = 0;
  uVar49 = 0x8421084210842109;
  do {
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar38 >> 1;
    piVar1 = sStack_1d0.modulus.v + ((byte)((uVar38 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                  ((long)(psVar34->modulus).v + (uVar38 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar38 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar75 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar38 & 0x3fU);
    uVar38 = uVar38 + 1;
  } while ((int)uVar38 != 0x100);
  sStack_170.modulus.v[4] =
       (int64_t)(sStack_1d0.modulus.v[1] | sStack_1d0.modulus.v[0] | sStack_1d0.modulus.v[2] |
                 sStack_1d0.modulus.v[3] | sStack_1d0.modulus.v[4]);
  sStack_1a0.modulus.v[0] = 0;
  sStack_1a0.modulus.v[1] = 0;
  sStack_1a0.modulus.v[2] = 0;
  sStack_1a0.modulus.v[3] = 0;
  sStack_1a0.modulus.v[4] = 0;
  psVar33 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (ulong)psVar33 >> 1;
    piVar1 = sStack_1a0.modulus.v + ((byte)(((ulong)psVar33 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                  ((long)(m_00->modulus).v + ((ulong)psVar33 >> 4 & 0xfffffff) * 2)
                                 >> ((uint)psVar33 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar5 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar33 & 0x3fU);
    iVar11 = sStack_1a0.modulus.v[0];
    psVar33 = (secp256k1_modinv64_modinfo *)((long)(psVar33->modulus).v + 1);
  } while ((int)psVar33 != 0x100);
  pcVar62 = (code *)0x3fffffffffffffff;
  pcStack_1d8 = (code *)0x14a46f;
  psVar44 = (secp256k1_modinv64_modinfo *)sStack_1a0.modulus.v[0];
  uVar17 = modinv2p64(sStack_1a0.modulus.v[0]);
  iVar12 = sStack_170.modulus.v[4];
  sStack_1a0.modulus_inv62 = uVar17 & 0x3fffffffffffffff;
  psVar58 = (secp256k1_modinv64_modinfo *)(iVar11 * uVar17 & 0x3fffffffffffffff);
  psVar23 = m_00;
  if (psVar58 == (secp256k1_modinv64_modinfo *)0x1) {
    psVar58 = (secp256k1_modinv64_modinfo *)0x3fffffffffffffff;
    if ((secp256k1_modinv64_modinfo *)sStack_170.modulus.v[4] == (secp256k1_modinv64_modinfo *)0x0)
    {
LAB_0014a5f0:
      sStack_1d0.modulus.v[2] = 0;
      sStack_1d0.modulus.v[3] = 0;
      sStack_1d0.modulus.v[0] = 0;
      sStack_1d0.modulus.v[1] = 0;
      sStack_1d0.modulus.v[4] = 0;
      uVar38 = 0;
      do {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar38 >> 1;
        piVar1 = sStack_1d0.modulus.v + ((byte)((uVar38 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
        *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                      ((long)(psVar34->modulus).v + (uVar38 >> 4 & 0xfffffff) * 2)
                                     >> ((uint)uVar38 & 0xf) & 1) != 0) <<
                            ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                             (char)uVar38 & 0x3fU);
        uVar38 = uVar38 + 1;
      } while ((int)uVar38 != 0x100);
      sStack_170.modulus_inv62 = (uint64_t)m_00;
      iVar14 = 8;
      do {
        uVar38 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                 secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                 secp256k1_test_state[0] >> 0x3e;
        lVar18 = sStack_1a0.modulus.v[uVar38];
        if (lVar18 < 1) {
          if ((lVar18 < 0) &&
             (lVar31 = sStack_1a0.modulus.v[uVar38 + 1], -0x4000000000000000 < lVar31)) {
            sStack_1a0.modulus.v[uVar38] = lVar18 + 0x4000000000000000;
            lVar31 = lVar31 + -1;
            goto LAB_0014a6c0;
          }
        }
        else {
          lVar31 = sStack_1a0.modulus.v[uVar38 + 1];
          if (lVar31 < 0x4000000000000000) {
            sStack_1a0.modulus.v[uVar38] = lVar18 + -0x4000000000000000;
            lVar31 = lVar31 + 1;
LAB_0014a6c0:
            sStack_1a0.modulus.v[uVar38 + 1] = lVar31;
          }
        }
        uVar53 = secp256k1_test_state[1] << 0x11;
        uVar50 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar38 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar50;
        secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar38;
        secp256k1_test_state[2] = uVar50 ^ uVar53;
        secp256k1_test_state[3] = uVar38 << 0x2d | uVar38 >> 0x13;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
      psVar23 = (secp256k1_modinv64_modinfo *)
                (ulong)((secp256k1_modinv64_modinfo *)iVar12 != (secp256k1_modinv64_modinfo *)0x0);
      psVar58 = (secp256k1_modinv64_modinfo *)0x3fffffffffffff01;
      while( true ) {
        cVar27 = (char)psVar58;
        pcVar62 = secp256k1_modinv64_var;
        if (cVar27 != '\0') {
          pcVar62 = secp256k1_modinv64;
        }
        pcStack_1d8 = (code *)0x14a74a;
        (*pcVar62)(&sStack_1d0);
        (psVar45->modulus).v[2] = 0;
        (psVar45->modulus).v[3] = 0;
        (psVar45->modulus).v[0] = 0;
        (psVar45->modulus).v[1] = 0;
        uVar38 = 0;
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = uVar38 >> 1;
          puVar3 = (ushort *)((long)(psVar45->modulus).v + (uVar38 >> 4 & 0xfffffff) * 2);
          *puVar3 = *puVar3 | (ushort)(((ulong)sStack_1d0.modulus.v
                                               [((byte)((uVar38 & 0xffffffff) >> 1) & 0x7f) / 0x1f]
                                        >> ((ulong)((SUB164(auVar9 * ZEXT816(0x8421084210842109),8)
                                                    >> 4) * 2 + (int)uVar38) & 0x3f) & 1) != 0) <<
                              ((byte)uVar38 & 0xf);
          uVar38 = uVar38 + 1;
        } while ((int)uVar38 != 0x100);
        psVar44 = &sStack_170;
        pcStack_1d8 = (code *)0x14a7bb;
        psVar33 = psVar45;
        mulmod256((uint16_t *)psVar44,(uint16_t *)psVar45,(uint16_t *)psVar34,
                  (uint16_t *)sStack_170.modulus_inv62);
        if ((ushort)sStack_170.modulus.v[0] !=
            ((secp256k1_modinv64_modinfo *)iVar12 != (secp256k1_modinv64_modinfo *)0x0)) break;
        lVar18 = 1;
        do {
          if (*(short *)((long)sStack_170.modulus.v + lVar18 * 2) != 0) {
            pcStack_1d8 = (code *)0x14a883;
            test_modinv64_uint16_cold_4();
            goto LAB_0014a883;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        pcStack_1d8 = (code *)0x14a7eb;
        (*pcVar62)(&sStack_1d0);
        sStack_170.modulus.v[2] = 0;
        sStack_170.modulus.v[3] = 0;
        sStack_170.modulus.v[0] = 0;
        sStack_170.modulus.v[1] = 0;
        psVar33 = (secp256k1_modinv64_modinfo *)0x0;
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = (ulong)psVar33 >> 1;
          psVar44 = (secp256k1_modinv64_modinfo *)
                    ((ulong)(((ulong)sStack_1d0.modulus.v
                                     [((byte)(((ulong)psVar33 & 0xffffffff) >> 1) & 0x7f) / 0x1f] >>
                              ((ulong)((SUB164(auVar10 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                      (int)psVar33) & 0x3f) & 1) != 0) << ((byte)psVar33 & 0xf));
          puVar3 = (ushort *)((long)sStack_170.modulus.v + ((ulong)psVar33 >> 4 & 0xfffffff) * 2);
          *puVar3 = *puVar3 | (ushort)psVar44;
          psVar33 = (secp256k1_modinv64_modinfo *)((long)(psVar33->modulus).v + 1);
        } while ((int)psVar33 != 0x100);
        lVar18 = 0;
        do {
          if (*(short *)((long)sStack_170.modulus.v + lVar18 * 2) !=
              *(short *)((long)(psVar34->modulus).v + lVar18 * 2)) goto LAB_0014a883;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        psVar58 = (secp256k1_modinv64_modinfo *)0x0;
        if (cVar27 == '\0') {
          return;
        }
      }
LAB_0014a888:
      pcStack_1d8 = (code *)0x14a88d;
      test_modinv64_uint16_cold_3();
      goto LAB_0014a88d;
    }
    pcStack_1d8 = (code *)0x14a4b2;
    mulmod256((uint16_t *)&sStack_170,(uint16_t *)psVar34,(uint16_t *)psVar34,(uint16_t *)m_00);
    sStack_1d0.modulus.v[2] = 0;
    sStack_1d0.modulus.v[3] = 0;
    sStack_1d0.modulus.v[0] = 0;
    sStack_1d0.modulus.v[1] = 0;
    sStack_1d0.modulus.v[4] = 0;
    uVar38 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar38 >> 1;
      piVar1 = sStack_1d0.modulus.v + ((byte)((uVar38 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
      *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                    ((long)sStack_170.modulus.v + (uVar38 >> 4 & 0xfffffff) * 2) >>
                                   ((uint)uVar38 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar6 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar38 & 0x3fU);
      uVar38 = uVar38 + 1;
    } while ((int)uVar38 != 0x100);
    psVar33 = &sStack_1a0;
    pcStack_1d8 = (code *)0x14a528;
    uVar13 = secp256k1_jacobi64_maybe_var(&sStack_1d0.modulus,psVar33);
    pcVar62 = (code *)iVar12;
    if (1 < uVar13) goto LAB_0014a892;
    uStack_140 = (short)(m_00->modulus).v[0] - 1;
    uStack_13e = *(undefined8 *)((long)(m_00->modulus).v + 2);
    iVar11 = (m_00->modulus).v[2];
    iStack_128 = (m_00->modulus).v[3];
    uStack_136 = (undefined6)*(undefined8 *)((long)(m_00->modulus).v + 10);
    uStack_130 = (undefined2)iVar11;
    uStack_12e = (undefined6)((ulong)iVar11 >> 0x10);
    pcStack_1d8 = (code *)0x14a561;
    mulmod256((uint16_t *)&sStack_170,(uint16_t *)&sStack_170,&uStack_140,(uint16_t *)m_00);
    sStack_1d0.modulus.v[2] = 0;
    sStack_1d0.modulus.v[3] = 0;
    sStack_1d0.modulus.v[0] = 0;
    sStack_1d0.modulus.v[1] = 0;
    sStack_1d0.modulus.v[4] = 0;
    uVar38 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar38 >> 1;
      piVar1 = sStack_1d0.modulus.v + ((byte)((uVar38 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
      *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                    ((long)sStack_170.modulus.v + (uVar38 >> 4 & 0xfffffff) * 2) >>
                                   ((uint)uVar38 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar38 & 0x3fU);
      uVar38 = uVar38 + 1;
    } while ((int)uVar38 != 0x100);
    psVar33 = &sStack_1a0;
    pcStack_1d8 = (code *)0x14a5d7;
    iVar14 = secp256k1_jacobi64_maybe_var(&sStack_1d0.modulus,psVar33);
    if ((iVar14 == 0) || (iVar14 == 1 - ((ushort)(m_00->modulus).v[0] & 2))) goto LAB_0014a5f0;
  }
  else {
LAB_0014a88d:
    pcStack_1d8 = (code *)0x14a892;
    test_modinv64_uint16_cold_1();
    psVar57 = psVar44;
LAB_0014a892:
    psVar63 = psVar57;
    pcStack_1d8 = (code *)0x14a897;
    test_modinv64_uint16_cold_6();
  }
  pcStack_1d8 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar63 & 1) != 0) {
    iVar14 = 6;
    do {
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    return;
  }
  pcStack_1e0 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_1e0 = (code *)0x8421084210842109;
  psStack_1e8 = psVar45;
  psStack_1f0 = psVar34;
  psStack_1f8 = (secp256k1_modinv64_modinfo *)pcVar62;
  psStack_200 = psVar58;
  psStack_208 = psVar23;
  sStack_240.modulus.v[4]._0_4_ = (int32_t)(psVar33->modulus).v[4];
  sStack_240.modulus.v[0] = (psVar33->modulus).v[0];
  sStack_240.modulus.v[2] = (psVar33->modulus).v[2];
  sStack_240.modulus.v[3] = (psVar33->modulus).v[3];
  sStack_240.modulus.v[1] = (psVar33->modulus).v[1];
  iVar11 = (psVar63->modulus).v[0];
  sStack_270.modulus.v[1] = (psVar63->modulus).v[1];
  piVar1 = (psVar63->modulus).v + 2;
  sStack_270.modulus.v[2] = *piVar1;
  sStack_270.modulus.v[3] = (psVar63->modulus).v[3];
  sStack_270.modulus.v[0]._0_4_ = (uint)iVar11;
  sStack_270.modulus.v[0]._4_4_ = (uint)((ulong)iVar11 >> 0x20);
  sStack_270.modulus.v[4]._0_4_ = (int)(psVar63->modulus).v[4];
  auVar75 = packssdw(*(undefined1 (*) [16])(psVar63->modulus).v,*(undefined1 (*) [16])piVar1);
  if (((((((((auVar75 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar75 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar75 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar75 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar75 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar75[0xf]) &&
     (-1 < (int)sStack_270.modulus.v[4])) {
    uVar13 = (uint)((ulong)sStack_270.modulus.v[1] >> 0x20) | (uint)sStack_270.modulus.v[1] |
             sStack_270.modulus.v[0]._4_4_ | (uint)sStack_270.modulus.v[0];
    psVar34 = (secp256k1_modinv64_modinfo *)(ulong)uVar13;
    psVar57 = psVar58;
    psVar44 = psVar33;
    if (((int)((ulong)sStack_270.modulus.v[3] >> 0x20) != 0 ||
        (((int)sStack_270.modulus.v[3] != 0 ||
         ((int)((ulong)sStack_270.modulus.v[2] >> 0x20) != 0 || (int)sStack_270.modulus.v[2] != 0))
        || uVar13 != 0)) || (int)sStack_270.modulus.v[4] != 0) {
      psStack_290 = (secp256k1_modinv64_modinfo *)0x9;
      uVar49 = 0xffffffff;
      iStack_288 = 0;
      psVar23 = (secp256k1_modinv64_modinfo *)(sStack_240.modulus.v[0] & 0xffffffff);
      psVar45 = (secp256k1_modinv64_modinfo *)0x0;
      psStack_210 = psVar33;
      do {
        psVar44 = psStack_210;
        psVar57 = psStack_290;
        uStack_284 = sStack_270.modulus.v[0]._4_4_ << 0x1e | (uint)sStack_270.modulus.v[0];
        uVar56 = sStack_240.modulus.v[0]._4_4_ << 0x1e | (uint)psVar23;
        psVar58 = (secp256k1_modinv64_modinfo *)(ulong)uVar56;
        uVar13 = 1;
        psVar54 = (secp256k1_modinv64_modinfo *)0x0;
        uVar15 = 0x1e;
        psVar63 = (secp256k1_modinv64_modinfo *)0x0;
        uVar60 = 1;
        psVar23 = psVar58;
        uVar42 = uStack_284;
        while( true ) {
          psVar34 = psVar45;
          psVar33 = (secp256k1_modinv64_modinfo *)(ulong)uStack_284;
          pcVar62 = (code *)&sStack_270;
          uVar61 = (uint)psVar23;
          uVar28 = -1 << ((byte)uVar15 & 0x1f) | uVar42;
          uVar20 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          bVar19 = (byte)uVar20;
          uVar42 = uVar42 >> (bVar19 & 0x1f);
          uVar60 = uVar60 << (bVar19 & 0x1f);
          uVar43 = (int)psVar63 << (bVar19 & 0x1f);
          psVar63 = (secp256k1_modinv64_modinfo *)(ulong)uVar43;
          uVar28 = (int)uVar49 - uVar20;
          uVar49 = (ulong)uVar28;
          psVar32 = (secp256k1_modinv64_modinfo *)((ulong)psVar23 >> 1);
          uVar67 = ((uint)((ulong)psVar23 >> 2) ^ (uint)psVar32) & uVar20 ^ (uint)psVar34;
          psVar45 = (secp256k1_modinv64_modinfo *)(ulong)uVar67;
          uVar15 = uVar15 - uVar20;
          uVar20 = (uint)psVar54;
          if (uVar15 == 0) break;
          if (((ulong)psVar23 & 1) == 0) {
            pcStack_298 = (code *)0x14ace2;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_0014ace2:
            pcStack_298 = (code *)0x14ace7;
            secp256k1_jacobi32_maybe_var_cold_5();
LAB_0014ace7:
            pcStack_298 = (code *)0x14acec;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_0014acec:
            psVar23 = psVar32;
            pcStack_298 = (code *)0x14acf1;
            secp256k1_jacobi32_maybe_var_cold_2();
            psVar54 = psVar58;
LAB_0014acf1:
            psVar58 = psVar54;
            pcStack_298 = (code *)0x14acf6;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_0014acf6;
          }
          if ((uVar42 & 1) == 0) goto LAB_0014ace2;
          uVar29 = uVar43 * uStack_284 + uVar60 * uVar56;
          psVar32 = (secp256k1_modinv64_modinfo *)(ulong)uVar29;
          bVar19 = 0x1e - (char)uVar15;
          uVar65 = uVar61 << (bVar19 & 0x1f);
          psVar34 = (secp256k1_modinv64_modinfo *)(ulong)uVar65;
          if (uVar29 != uVar65) goto LAB_0014ace7;
          uVar65 = uVar13 * uStack_284 + uVar20 * uVar56;
          psVar34 = (secp256k1_modinv64_modinfo *)(ulong)uVar65;
          uVar29 = uVar42 << (bVar19 & 0x1f);
          psVar32 = (secp256k1_modinv64_modinfo *)(ulong)uVar29;
          if (uVar65 != uVar29) goto LAB_0014acec;
          psVar34 = psVar54;
          if ((int)uVar28 < 0) {
            uVar49 = (ulong)-uVar28;
            psVar45 = (secp256k1_modinv64_modinfo *)(ulong)(uVar67 ^ (uVar42 & uVar61) >> 1);
            psVar23 = (secp256k1_modinv64_modinfo *)(ulong)uVar42;
            psVar63 = (secp256k1_modinv64_modinfo *)(ulong)uVar13;
            psVar34 = (secp256k1_modinv64_modinfo *)(ulong)uVar60;
            uVar60 = uVar20;
            uVar42 = uVar61;
            uVar13 = uVar43;
          }
          uVar20 = (int)uVar49 + 1;
          if ((int)uVar15 <= (int)uVar20) {
            uVar20 = uVar15;
          }
          psVar33 = psVar58;
          psVar54 = (secp256k1_modinv64_modinfo *)(ulong)uVar13;
          if (0x1e < uVar20) goto LAB_0014acf1;
          uVar61 = (uint)(0xff << (-(char)uVar20 & 0x1fU)) >> (-(char)uVar20 & 0x1fU);
          uVar20 = secp256k1_modinv32_inv256[(uint)((ulong)psVar23 >> 1) & 0x7f] * uVar42 & uVar61;
          uVar42 = uVar20 * (int)psVar23 + uVar42;
          psVar54 = (secp256k1_modinv64_modinfo *)(ulong)(uVar20 * uVar60 + (int)psVar34);
          uVar13 = uVar20 * (int)psVar63 + uVar13;
          psVar33 = (secp256k1_modinv64_modinfo *)(ulong)uStack_284;
          if ((uVar42 & uVar61) != 0) {
LAB_0014acf6:
            pcVar62 = (code *)&sStack_270;
            pcStack_298 = (code *)0x14acfb;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_0014acfb;
          }
        }
        lVar18 = (long)(int)uVar13 * (long)(int)uVar60 - (long)(int)uVar20 * (long)(int)uVar43;
        psVar23 = &sStack_240;
        sStack_280.u = uVar60;
        sStack_280.v = uVar43;
        sStack_280.q = uVar20;
        sStack_280.r = uVar13;
        if ((lVar18 != -0x40000000) && (lVar18 != 0x40000000)) goto LAB_0014ad2d;
        iVar21 = (int)psStack_290;
        psVar33 = (secp256k1_modinv64_modinfo *)((ulong)psStack_290 & 0xffffffff);
        pcStack_298 = (code *)0x14ab7f;
        psVar63 = psVar23;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar23,iVar21,
                            (secp256k1_modinv32_signed30 *)psStack_210,0);
        if (iVar14 < 1) goto LAB_0014ad00;
        psVar33 = (secp256k1_modinv64_modinfo *)((ulong)psVar57 & 0xffffffff);
        pcStack_298 = (code *)0x14ab9a;
        psVar63 = psVar23;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar23,iVar21,
                            (secp256k1_modinv32_signed30 *)psVar44,1);
        if (0 < iVar14) goto LAB_0014ad05;
        psVar33 = (secp256k1_modinv64_modinfo *)((ulong)psVar57 & 0xffffffff);
        pcStack_298 = (code *)0x14abb2;
        psVar63 = (secp256k1_modinv64_modinfo *)pcVar62;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar62,iVar21,
                            (secp256k1_modinv32_signed30 *)psVar44,0);
        if (iVar14 < 1) goto LAB_0014ad0a;
        psVar33 = (secp256k1_modinv64_modinfo *)((ulong)psVar57 & 0xffffffff);
        pcStack_298 = (code *)0x14abcd;
        psVar63 = (secp256k1_modinv64_modinfo *)pcVar62;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar62,iVar21,
                            (secp256k1_modinv32_signed30 *)psVar44,1);
        if (-1 < iVar14) goto LAB_0014ad0f;
        pcStack_298 = (code *)0x14abe8;
        secp256k1_modinv32_update_fg_30_var
                  (iVar21,(secp256k1_modinv32_signed30 *)psVar23,
                   (secp256k1_modinv32_signed30 *)pcVar62,&sStack_280);
        psVar23 = (secp256k1_modinv64_modinfo *)(sStack_240.modulus.v[0] & 0xffffffff);
        if ((int)sStack_240.modulus.v[0] == 1) {
          if (iVar21 < 2) {
            return;
          }
          uVar13 = 0;
          uVar38 = 1;
          do {
            uVar13 = uVar13 | *(uint *)((long)sStack_240.modulus.v + uVar38 * 4);
            uVar38 = uVar38 + 1;
          } while (((ulong)psVar57 & 0xffffffff) != uVar38);
          psVar57 = psStack_290;
          if (uVar13 == 0) {
            return;
          }
        }
        iVar14 = (int)psVar57;
        psVar57 = (secp256k1_modinv64_modinfo *)((ulong)psVar57 & 0xffffffff);
        if ((-1 < iVar14 + -2 && *(int *)((long)sStack_240.modulus.v + (long)iVar14 * 4 + -4) == 0)
            && *(int *)((long)sStack_270.modulus.v + (long)iVar14 * 4 + -4) == 0) {
          psVar57 = (secp256k1_modinv64_modinfo *)(ulong)(iVar14 - 1);
        }
        pcVar62 = (code *)&sStack_240;
        pcStack_298 = (code *)0x14ac4e;
        iVar21 = (int)psVar57;
        psVar33 = psVar57;
        psVar63 = (secp256k1_modinv64_modinfo *)pcVar62;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar62,iVar21,
                            (secp256k1_modinv32_signed30 *)psVar44,0);
        if (iVar14 < 1) goto LAB_0014ad14;
        pcStack_298 = (code *)0x14ac69;
        psVar33 = psVar57;
        psVar63 = (secp256k1_modinv64_modinfo *)pcVar62;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar62,iVar21,
                            (secp256k1_modinv32_signed30 *)psVar44,1);
        if (0 < iVar14) goto LAB_0014ad19;
        pcVar62 = (code *)&sStack_270;
        pcStack_298 = (code *)0x14ac86;
        psVar33 = psVar57;
        psVar63 = (secp256k1_modinv64_modinfo *)pcVar62;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar62,iVar21,
                            (secp256k1_modinv32_signed30 *)psVar44,0);
        if (iVar14 < 1) goto LAB_0014ad1e;
        pcStack_298 = (code *)0x14aca5;
        psVar33 = psVar57;
        psVar63 = (secp256k1_modinv64_modinfo *)pcVar62;
        psStack_290 = psVar57;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar62,iVar21,
                            (secp256k1_modinv32_signed30 *)psVar44,1);
        if (-1 < iVar14) goto LAB_0014ad23;
        iStack_288 = iStack_288 + 1;
        if (iStack_288 == 0x19) {
          return;
        }
      } while( true );
    }
  }
  else {
LAB_0014acfb:
    pcStack_298 = (code *)0x14ad00;
    secp256k1_jacobi32_maybe_var_cold_17();
    psVar57 = psVar58;
    psVar44 = psVar34;
LAB_0014ad00:
    pcStack_298 = (code *)0x14ad05;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_0014ad05:
    pcStack_298 = (code *)0x14ad0a;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_0014ad0a:
    pcStack_298 = (code *)0x14ad0f;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_0014ad0f:
    pcStack_298 = (code *)0x14ad14;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_0014ad14:
    pcStack_298 = (code *)0x14ad19;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_0014ad19:
    pcStack_298 = (code *)0x14ad1e;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_0014ad1e:
    pcStack_298 = (code *)0x14ad23;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_0014ad23:
    pcStack_298 = (code *)0x14ad28;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar34 = psVar33;
  }
  psVar33 = psVar34;
  pcStack_298 = (code *)0x14ad2d;
  secp256k1_jacobi32_maybe_var_cold_16();
LAB_0014ad2d:
  pcStack_298 = secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  pcStack_298 = (code *)uVar49;
  psStack_2a0 = psVar45;
  psStack_2a8 = psVar44;
  psStack_2b0 = (secp256k1_modinv64_modinfo *)pcVar62;
  psStack_2b8 = psVar57;
  psStack_2c0 = psVar23;
  auStack_308._16_8_ = 0;
  auStack_308._24_8_ = 0;
  auStack_308._0_8_ = 0;
  auStack_308._8_8_ = 0;
  auStack_308._32_4_ = 0;
  uStack_2d0 = 0;
  uStack_2c8 = 0;
  uStack_2e0 = 0;
  uStack_2d8 = 0;
  auStack_308._36_4_ = 1;
  sStack_378.modulus.v[4]._0_4_ = (int32_t)(psVar33->modulus).v[4];
  uStack_340 = psVar33;
  sStack_378.modulus.v[2] = (psVar33->modulus).v[2];
  sStack_378.modulus.v[3] = (psVar33->modulus).v[3];
  sStack_378.modulus.v[0] = (psVar33->modulus).v[0];
  sStack_378.modulus.v[1] = (psVar33->modulus).v[1];
  sStack_338.modulus.v[4]._0_4_ = (int32_t)(psVar63->modulus).v[4];
  sStack_338.modulus.v[0] = (psVar63->modulus).v[0];
  sStack_338.modulus.v[1] = (psVar63->modulus).v[1];
  psStack_348 = psVar63;
  sStack_338.modulus.v[2] = (psVar63->modulus).v[2];
  sStack_338.modulus.v[3] = (psVar63->modulus).v[3];
  iStack_394 = 0;
  uVar49 = 0xffffffff;
  psStack_390 = (secp256k1_modinv64_modinfo *)0x9;
LAB_0014adc7:
  psVar34 = uStack_340;
  psVar57 = psStack_390;
  psVar44 = (secp256k1_modinv64_modinfo *)(sStack_378.modulus.v[0] & 0xffffffff);
  psVar63 = (secp256k1_modinv64_modinfo *)(sStack_338.modulus.v[0] & 0xffffffff);
  uVar13 = 1;
  psVar23 = (secp256k1_modinv64_modinfo *)0x0;
  iVar14 = 0x1e;
  uVar15 = 0;
  psVar33 = (secp256k1_modinv64_modinfo *)0x1;
  uVar60 = (uint)sStack_378.modulus.v[0];
  uVar42 = (uint)sStack_338.modulus.v[0];
  while( true ) {
    uVar56 = -1 << ((byte)iVar14 & 0x1f) | uVar42;
    iVar21 = 0;
    if (uVar56 != 0) {
      for (; (uVar56 >> iVar21 & 1) == 0; iVar21 = iVar21 + 1) {
      }
    }
    bVar19 = (byte)iVar21;
    uVar42 = uVar42 >> (bVar19 & 0x1f);
    uVar20 = (int)psVar33 << (bVar19 & 0x1f);
    psVar33 = (secp256k1_modinv64_modinfo *)(ulong)uVar20;
    uVar15 = uVar15 << (bVar19 & 0x1f);
    uVar61 = (int)uVar49 - iVar21;
    uVar49 = (ulong)uVar61;
    iVar14 = iVar14 - iVar21;
    iVar21 = (int)psVar23;
    if (iVar14 == 0) break;
    if ((uVar60 & 1) == 0) {
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b1ee;
      secp256k1_modinv32_var_cold_7();
LAB_0014b1ee:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b1f3;
      secp256k1_modinv32_var_cold_6();
LAB_0014b1f3:
      psVar58 = (secp256k1_modinv64_modinfo *)(ulong)uVar56;
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b1f8;
      secp256k1_modinv32_var_cold_1();
LAB_0014b1f8:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b1fd;
      secp256k1_modinv32_var_cold_2();
LAB_0014b1fd:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b202;
      secp256k1_modinv32_var_cold_5();
LAB_0014b202:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b207;
      secp256k1_modinv32_var_cold_4();
      goto LAB_0014b207;
    }
    if ((uVar42 & 1) == 0) goto LAB_0014b1ee;
    uVar56 = uVar15 * (uint)sStack_338.modulus.v[0] + uVar20 * (uint)sStack_378.modulus.v[0];
    bVar19 = 0x1e - (char)iVar14;
    uVar28 = uVar60 << (bVar19 & 0x1f);
    pcVar62 = (code *)(ulong)uVar28;
    if (uVar56 != uVar28) goto LAB_0014b1f3;
    uVar56 = uVar13 * (uint)sStack_338.modulus.v[0] + iVar21 * (uint)sStack_378.modulus.v[0];
    pcVar62 = (code *)(ulong)uVar56;
    uVar28 = uVar42 << (bVar19 & 0x1f);
    psVar58 = (secp256k1_modinv64_modinfo *)(ulong)uVar28;
    if (uVar56 != uVar28) goto LAB_0014b1f8;
    if (uVar61 - 0x2f0 < 0xfffffa21) goto LAB_0014b1fd;
    psVar58 = psVar23;
    if ((int)uVar61 < 0) {
      uVar49 = (ulong)-uVar61;
      uVar56 = -uVar60;
      uVar61 = -uVar15;
      psVar33 = psVar23;
      psVar58 = (secp256k1_modinv64_modinfo *)(ulong)-uVar20;
      uVar60 = uVar42;
      uVar42 = uVar56;
      uVar15 = uVar13;
      uVar13 = uVar61;
    }
    pcVar62 = (code *)(ulong)uVar13;
    iVar21 = (int)uVar49 + 1;
    if (iVar14 <= iVar21) {
      iVar21 = iVar14;
    }
    if (iVar21 - 0x1fU < 0xffffffe2) goto LAB_0014b202;
    uVar20 = (uint)(0xff << (-(char)iVar21 & 0x1fU)) >> (-(char)iVar21 & 0x1fU);
    psVar45 = (secp256k1_modinv64_modinfo *)(ulong)uVar20;
    uVar56 = secp256k1_modinv32_inv256[uVar60 >> 1 & 0x7f] * uVar42 & uVar20;
    uVar42 = uVar42 + uVar56 * uVar60;
    psVar23 = (secp256k1_modinv64_modinfo *)(ulong)(uVar56 * (int)psVar33 + (int)psVar58);
    uVar13 = uVar56 * uVar15 + uVar13;
    if ((uVar42 & uVar20) != 0) {
LAB_0014b207:
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b20c;
      secp256k1_modinv32_var_cold_3();
      psVar57 = psVar58;
      goto LAB_0014b20c;
    }
  }
  sStack_388.u = uVar20;
  sStack_388.v = uVar15;
  sStack_388.q = iVar21;
  sStack_388.r = uVar13;
  if ((long)(int)uVar13 * (long)(int)uVar20 - (long)iVar21 * (long)(int)uVar15 == 0x40000000) {
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14af6d;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_308,
               (secp256k1_modinv32_signed30 *)(auStack_308 + 0x24),&sStack_388,
               (secp256k1_modinv32_modinfo *)uStack_340);
    psVar45 = &sStack_378;
    iVar21 = (int)psVar57;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14af85;
    psVar44 = psVar57;
    psVar63 = psVar45;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar45,iVar21,
                        (secp256k1_modinv32_signed30 *)psVar34,-1);
    if (iVar14 < 1) goto LAB_0014b211;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14afa0;
    psVar44 = psVar57;
    psVar63 = psVar45;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar45,iVar21,
                        (secp256k1_modinv32_signed30 *)psVar34,1);
    if (0 < iVar14) goto LAB_0014b216;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14afbb;
    psVar44 = psVar57;
    psVar63 = &sStack_338;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar21,
                        (secp256k1_modinv32_signed30 *)psVar34,-1);
    if (iVar14 < 1) goto LAB_0014b21b;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14afd6;
    psVar44 = psVar57;
    psVar63 = &sStack_338;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar21,
                        (secp256k1_modinv32_signed30 *)psVar34,1);
    if (-1 < iVar14) goto LAB_0014b220;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14aff3;
    secp256k1_modinv32_update_fg_30_var
              (iVar21,(secp256k1_modinv32_signed30 *)&sStack_378,
               (secp256k1_modinv32_signed30 *)&sStack_338,&sStack_388);
    if ((uint)sStack_338.modulus.v[0] == 0) {
      if (1 < iVar21) {
        uVar13 = 0;
        psVar63 = (secp256k1_modinv64_modinfo *)0x1;
        do {
          uVar13 = uVar13 | *(uint *)((long)sStack_338.modulus.v + (long)psVar63 * 4);
          psVar63 = (secp256k1_modinv64_modinfo *)((long)(psVar63->modulus).v + 1);
        } while (psVar57 != psVar63);
        if (uVar13 != 0) goto LAB_0014b022;
      }
      psVar63 = &sStack_338;
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b0fe;
      psVar44 = psVar57;
      iVar14 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar63,iVar21,&SECP256K1_SIGNED30_ONE,0);
      psVar33 = psVar57;
      if (iVar14 != 0) goto LAB_0014b23e;
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b11f;
      iVar14 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)&sStack_378,iVar21,&SECP256K1_SIGNED30_ONE,
                          -1);
      psVar33 = psStack_348;
      if (iVar14 != 0) {
        psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b144;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)&sStack_378,iVar21,
                            &SECP256K1_SIGNED30_ONE,1);
        if (iVar14 != 0) {
          psVar44 = (secp256k1_modinv64_modinfo *)0x9;
          psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b15e;
          psVar63 = psVar33;
          iVar14 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar33,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar14 != 0) goto LAB_0014b243;
          psVar63 = (secp256k1_modinv64_modinfo *)auStack_308;
          psVar44 = (secp256k1_modinv64_modinfo *)0x9;
          psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b181;
          iVar14 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar63,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar14 != 0) goto LAB_0014b243;
          psVar63 = &sStack_378;
          psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b19e;
          psVar44 = psVar57;
          iVar14 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar63,iVar21,
                              (secp256k1_modinv32_signed30 *)psVar34,1);
          if (iVar14 != 0) goto LAB_0014b243;
        }
      }
      psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b1c0;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_308,
                 *(int32_t *)((long)sStack_378.modulus.v + (long)iVar21 * 4 + -4),
                 (secp256k1_modinv32_modinfo *)psVar34);
      *(undefined4 *)((psVar33->modulus).v + 4) = auStack_308._32_4_;
      (psVar33->modulus).v[2] = auStack_308._16_8_;
      (psVar33->modulus).v[3] = auStack_308._24_8_;
      (psVar33->modulus).v[0] = auStack_308._0_8_;
      (psVar33->modulus).v[1] = auStack_308._8_8_;
      return;
    }
LAB_0014b022:
    uVar13 = *(uint *)((long)sStack_378.modulus.v + (long)iVar21 * 4 + -4);
    uVar60 = *(uint *)((long)&uStack_340 + (long)iVar21 * 4 + 4);
    iVar14 = iVar21 + -2;
    uVar42 = (int)uVar13 >> 0x1f ^ uVar13 | iVar14 >> 0x1f;
    psVar63 = (secp256k1_modinv64_modinfo *)(ulong)uVar42;
    uVar42 = (int)uVar60 >> 0x1f ^ uVar60 | uVar42;
    psVar44 = (secp256k1_modinv64_modinfo *)(ulong)uVar42;
    if (uVar42 == 0) {
      psVar57 = (secp256k1_modinv64_modinfo *)(ulong)(iVar21 - 1);
      puVar2 = (uint *)((long)sStack_378.modulus.v + (long)iVar14 * 4);
      *puVar2 = *puVar2 | uVar13 << 0x1e;
      puVar2 = (uint *)((long)sStack_338.modulus.v + (long)iVar14 * 4);
      *puVar2 = *puVar2 | uVar60 << 0x1e;
    }
    psVar45 = &sStack_378;
    if (iStack_394 == 0x18) goto LAB_0014b225;
    iVar21 = (int)psVar57;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b081;
    psVar44 = psVar57;
    psVar63 = psVar45;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar45,iVar21,
                        (secp256k1_modinv32_signed30 *)psVar34,-1);
    if (iVar14 < 1) goto LAB_0014b22a;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b09c;
    psVar44 = psVar57;
    psVar63 = psVar45;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar45,iVar21,
                        (secp256k1_modinv32_signed30 *)psVar34,1);
    if (0 < iVar14) goto LAB_0014b22f;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b0b7;
    psVar44 = psVar57;
    psVar63 = &sStack_338;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar21,
                        (secp256k1_modinv32_signed30 *)psVar34,-1);
    if (iVar14 < 1) goto LAB_0014b234;
    psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b0d2;
    psVar44 = psVar57;
    psVar63 = &sStack_338;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_338,iVar21,
                        (secp256k1_modinv32_signed30 *)psVar34,1);
    if (-1 < iVar14) goto LAB_0014b239;
    iStack_394 = iStack_394 + 1;
    psStack_390 = psVar57;
    goto LAB_0014adc7;
  }
LAB_0014b20c:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b211;
  secp256k1_modinv32_var_cold_8();
  psVar34 = psVar33;
LAB_0014b211:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b216;
  secp256k1_modinv32_var_cold_19();
LAB_0014b216:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b21b;
  secp256k1_modinv32_var_cold_18();
LAB_0014b21b:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b220;
  secp256k1_modinv32_var_cold_17();
LAB_0014b220:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b225;
  secp256k1_modinv32_var_cold_16();
LAB_0014b225:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b22a;
  secp256k1_modinv32_var_cold_13();
LAB_0014b22a:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b22f;
  secp256k1_modinv32_var_cold_12();
LAB_0014b22f:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b234;
  secp256k1_modinv32_var_cold_11();
LAB_0014b234:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b239;
  secp256k1_modinv32_var_cold_10();
LAB_0014b239:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b23e;
  secp256k1_modinv32_var_cold_9();
  psVar33 = psVar57;
LAB_0014b23e:
  psVar57 = psVar45;
  psStack_3a0 = (secp256k1_modinv64_modinfo *)0x14b243;
  secp256k1_modinv32_var_cold_14();
LAB_0014b243:
  psStack_3a0 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  psStack_3a0 = &sStack_338;
  psStack_3a8 = psVar57;
  psStack_3b0 = psVar33;
  psStack_3b8 = (secp256k1_modinv64_modinfo *)pcVar62;
  uStack_3c0 = uVar49;
  psStack_3c8 = psVar34;
  auStack_410._16_8_ = 0;
  auStack_410._24_8_ = 0;
  auStack_410._0_8_ = 0;
  auStack_410._8_8_ = 0;
  auStack_410._32_4_ = 0;
  uStack_3d8 = 0;
  uStack_3d0 = 0;
  uStack_3e8 = 0;
  uStack_3e0 = 0;
  auStack_410._36_4_ = 1;
  sStack_480.modulus.v[4]._0_4_ = (int32_t)(psVar44->modulus).v[4];
  sStack_480.modulus.v[2] = (psVar44->modulus).v[2];
  sStack_480.modulus.v[3] = (psVar44->modulus).v[3];
  sStack_480.modulus.v[0] = (psVar44->modulus).v[0];
  sStack_480.modulus.v[1] = (psVar44->modulus).v[1];
  sStack_440.modulus.v[4]._0_4_ = (int32_t)(psVar63->modulus).v[4];
  sStack_440.modulus.v[0] = (psVar63->modulus).v[0];
  sStack_440.modulus.v[1] = (psVar63->modulus).v[1];
  sStack_480.modulus_inv62 = (uint64_t)psVar63;
  sStack_440.modulus.v[2] = (psVar63->modulus).v[2];
  sStack_440.modulus.v[3] = (psVar63->modulus).v[3];
  iVar14 = 0;
  uVar49 = 0xffffffff;
  psStack_4a8 = psVar44;
  do {
    uStack_448 = (ulong)(int)(uint)sStack_480.modulus.v[0];
    uVar50 = (ulong)(int)(uint)sStack_440.modulus.v[0];
    uVar38 = 0;
    psVar45 = (secp256k1_modinv64_modinfo *)0x1;
    uVar13 = 0;
    uVar15 = 0;
    uVar56 = 1;
    uVar60 = (uint)sStack_440.modulus.v[0];
    uVar42 = (uint)sStack_480.modulus.v[0];
    do {
      uVar20 = (uint)sStack_480.modulus.v[0];
      iStack_49c = iVar14;
      if ((uVar42 & 1) == 0) {
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b706;
        secp256k1_modinv32_cold_17();
LAB_0014b706:
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b70b;
        secp256k1_modinv32_cold_1();
LAB_0014b70b:
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b710;
        secp256k1_modinv32_cold_2();
        psVar63 = (secp256k1_modinv64_modinfo *)pcVar62;
LAB_0014b710:
        uVar56 = uVar20;
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b715;
        secp256k1_modinv32_cold_16();
        goto LAB_0014b715;
      }
      uVar28 = (uint)psVar45;
      uVar43 = uVar13 * (uint)sStack_440.modulus.v[0] + uVar28 * (uint)sStack_480.modulus.v[0];
      psVar33 = (secp256k1_modinv64_modinfo *)(ulong)uVar43;
      uVar61 = uVar42 << ((byte)uVar38 & 0x1f);
      psVar34 = (secp256k1_modinv64_modinfo *)(ulong)uVar61;
      if (uVar43 != uVar61) goto LAB_0014b706;
      uVar43 = uVar56 * (uint)sStack_440.modulus.v[0] + uVar15 * (uint)sStack_480.modulus.v[0];
      psVar33 = (secp256k1_modinv64_modinfo *)(ulong)uVar43;
      uVar61 = uVar60 << ((byte)uVar38 & 0x1f);
      psVar34 = (secp256k1_modinv64_modinfo *)(ulong)uVar61;
      if (uVar43 != uVar61) goto LAB_0014b70b;
      uStack_494 = (int)(uint)uVar49 >> 0x1f;
      psVar33 = (secp256k1_modinv64_modinfo *)(ulong)uStack_494;
      uStack_498 = uVar60 & 1;
      uVar61 = -uStack_498;
      psVar57 = (secp256k1_modinv64_modinfo *)(ulong)uVar61;
      uVar43 = uStack_494 & uVar61;
      psVar34 = (secp256k1_modinv64_modinfo *)(ulong)uVar43;
      uVar67 = (uint)uVar49 ^ uVar43;
      uVar49 = (ulong)uVar67;
      psVar63 = (secp256k1_modinv64_modinfo *)(ulong)(uVar67 - 0x25b);
      if (uVar67 - 0x25b < 0xfffffb4d) goto LAB_0014b710;
      uVar49 = (ulong)(uVar67 - 1);
      uVar56 = uVar56 + ((uStack_494 ^ uVar13) - uStack_494 & uVar61);
      uVar13 = (uVar13 + (uVar56 & uVar43)) * 2;
      uVar15 = uVar15 + ((uStack_494 ^ uVar28) - uStack_494 & uVar61);
      uVar20 = (uVar28 + (uVar15 & uVar43)) * 2;
      psVar45 = (secp256k1_modinv64_modinfo *)(ulong)uVar20;
      uVar61 = ((uStack_494 ^ uVar42) - uStack_494 & uVar61) + uVar60;
      uVar60 = uVar61 >> 1;
      uVar61 = uVar61 & uVar43;
      pcVar62 = (code *)(ulong)uVar61;
      uVar42 = uVar42 + uVar61;
      uVar61 = (int)uVar38 + 1;
      uVar38 = (ulong)uVar61;
    } while (uVar61 != 0x1e);
    psVar33 = (secp256k1_modinv64_modinfo *)(long)(int)uVar20;
    psVar63 = (secp256k1_modinv64_modinfo *)(long)(int)uVar13;
    psVar57 = (secp256k1_modinv64_modinfo *)(long)(int)uVar15;
    uVar38 = (long)psVar33 * (long)(int)uVar56 - (long)psVar63 * (long)psVar57;
    sStack_490.u = uVar20;
    sStack_490.v = uVar13;
    sStack_490.q = uVar15;
    sStack_490.r = uVar56;
    if (uVar38 != 0x40000000) {
LAB_0014b715:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b71a;
      secp256k1_modinv32_cold_3();
LAB_0014b71a:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b71f;
      secp256k1_modinv32_cold_15();
LAB_0014b71f:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b724;
      secp256k1_modinv32_cold_14();
LAB_0014b724:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b729;
      secp256k1_modinv32_cold_13();
LAB_0014b729:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b72e;
      secp256k1_modinv32_cold_12();
LAB_0014b72e:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b733;
      secp256k1_modinv32_cold_4();
LAB_0014b733:
      pcVar62 = (code *)psVar63;
      uVar13 = (uint)uVar38;
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b738;
      secp256k1_modinv32_cold_5();
LAB_0014b738:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b73d;
      secp256k1_modinv32_cold_11();
LAB_0014b73d:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b742;
      secp256k1_modinv32_cold_10();
LAB_0014b742:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b747;
      secp256k1_modinv32_cold_9();
LAB_0014b747:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b74c;
      secp256k1_modinv32_cold_8();
      goto LAB_0014b74c;
    }
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b43a;
    lStack_450 = (long)(int)uVar56;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_410,
               (secp256k1_modinv32_signed30 *)(auStack_410 + 0x24),&sStack_490,
               (secp256k1_modinv32_modinfo *)psStack_4a8);
    psVar34 = &sStack_480;
    uVar56 = 9;
    uVar38 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b456;
    psVar45 = psVar34;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar34,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,-1);
    if (iVar14 < 1) goto LAB_0014b71a;
    uVar56 = 9;
    uVar38 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b475;
    psVar45 = psVar34;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar34,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,1);
    if (0 < iVar14) goto LAB_0014b71f;
    psVar34 = &sStack_440;
    uVar56 = 9;
    uVar38 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b499;
    psVar45 = psVar34;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar34,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,-1);
    if (iVar14 < 1) goto LAB_0014b724;
    uVar56 = 9;
    uVar38 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b4b8;
    psVar45 = psVar34;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar34,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,1);
    pcVar62 = (code *)psStack_4a8;
    if (-1 < iVar14) goto LAB_0014b729;
    psVar34 = (secp256k1_modinv64_modinfo *)((long)psVar63 * uVar50 + (long)psVar33 * uStack_448);
    uVar38 = uStack_448;
    if (((ulong)psVar34 & 0x3ffffffe) != 0) goto LAB_0014b72e;
    uVar38 = uStack_448 * (long)psVar57;
    uVar50 = uVar50 * lStack_450 + uVar38;
    if ((uVar50 & 0x3fffffff) != 0) goto LAB_0014b733;
    uVar50 = (long)uVar50 >> 0x1e;
    psVar34 = (secp256k1_modinv64_modinfo *)((long)psVar34 >> 0x1e);
    lVar18 = 1;
    do {
      lVar31 = (long)*(int *)((long)sStack_480.modulus.v + lVar18 * 4);
      lVar24 = (long)*(int *)((long)sStack_440.modulus.v + lVar18 * 4);
      lVar26 = (long)(psVar34->modulus).v + lVar24 * (long)psVar63 + lVar31 * (long)psVar33;
      lVar31 = lVar24 * lStack_450 + lVar31 * (long)psVar57 + uVar50;
      *(uint *)((long)sStack_480.modulus.v + lVar18 * 4 + -4) = (uint)lVar26 & 0x3fffffff;
      *(uint *)((long)&uStack_448 + lVar18 * 4 + 4) = (uint)lVar31 & 0x3fffffff;
      lVar18 = lVar18 + 1;
      uVar50 = lVar31 >> 0x1e;
      psVar34 = (secp256k1_modinv64_modinfo *)(lVar26 >> 0x1e);
    } while (lVar18 != 9);
    sStack_440.modulus.v[4]._0_4_ = (int32_t)uVar50;
    psVar33 = &sStack_480;
    uVar56 = 9;
    uVar13 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b58a;
    psVar45 = psVar33;
    sStack_480.modulus.v[4]._0_4_ = (int32_t)psVar34;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar33,9,
                        (secp256k1_modinv32_signed30 *)psStack_4a8,-1);
    if (iVar14 < 1) goto LAB_0014b738;
    uVar56 = 9;
    uVar13 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b5a7;
    psVar45 = psVar33;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar33,9,
                        (secp256k1_modinv32_signed30 *)pcVar62,1);
    if (0 < iVar14) goto LAB_0014b73d;
    psVar33 = &sStack_440;
    uVar56 = 9;
    uVar13 = 0xffffffff;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b5c9;
    psVar45 = psVar33;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar33,9,
                        (secp256k1_modinv32_signed30 *)pcVar62,-1);
    if (iVar14 < 1) goto LAB_0014b742;
    uVar56 = 9;
    uVar13 = 1;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b5e6;
    psVar45 = psVar33;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar33,9,
                        (secp256k1_modinv32_signed30 *)pcVar62,1);
    if (-1 < iVar14) goto LAB_0014b747;
    iVar14 = iStack_49c + 1;
  } while (iVar14 != 0x14);
  psVar45 = &sStack_440;
  uVar56 = 9;
  uVar13 = 0;
  psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b615;
  iVar14 = secp256k1_modinv32_mul_cmp_30
                     ((secp256k1_modinv32_signed30 *)psVar45,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar14 == 0) {
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b638;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_480,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar33 = (secp256k1_modinv64_modinfo *)sStack_480.modulus_inv62;
    if (iVar14 == 0) {
LAB_0014b6c0:
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b6d5;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_410,(int32_t)psVar34,
                 (secp256k1_modinv32_modinfo *)pcVar62);
      *(undefined4 *)((psVar33->modulus).v + 4) = auStack_410._32_4_;
      (psVar33->modulus).v[2] = auStack_410._16_8_;
      (psVar33->modulus).v[3] = auStack_410._24_8_;
      (psVar33->modulus).v[0] = auStack_410._0_8_;
      (psVar33->modulus).v[1] = auStack_410._8_8_;
      return;
    }
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b65c;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_480,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar14 == 0) goto LAB_0014b6c0;
    uVar56 = 9;
    uVar13 = 0;
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b676;
    psVar45 = psVar33;
    iVar14 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar33,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar14 == 0) {
      psVar45 = (secp256k1_modinv64_modinfo *)auStack_410;
      uVar56 = 9;
      uVar13 = 0;
      psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b699;
      iVar14 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar45,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar14 == 0) {
        psVar45 = &sStack_480;
        uVar56 = 9;
        uVar13 = 1;
        psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b6b8;
        iVar14 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar45,9,
                            (secp256k1_modinv32_signed30 *)pcVar62,1);
        if (iVar14 == 0) goto LAB_0014b6c0;
      }
    }
  }
  else {
LAB_0014b74c:
    psStack_4b8 = (secp256k1_modinv64_modinfo *)0x14b751;
    secp256k1_modinv32_cold_6();
  }
  psStack_4b8 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_508;
  piVar35 = (int *)(ulong)uVar13;
  pcStack_510 = (code *)0x14b776;
  psStack_4c0 = psVar34;
  psStack_4b8 = psVar33;
  secp256k1_modinv32_mul_30(&sStack_4e4,(secp256k1_modinv32_signed30 *)psVar45,uVar56,1);
  pcStack_510 = (code *)0x14b788;
  piVar55 = piVar35;
  psVar39 = a_00;
  secp256k1_modinv32_mul_30(&sStack_508,a_00,9,uVar13);
  lVar18 = 0;
  while ((uint)sStack_4e4.v[lVar18] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_508.v[lVar18]) goto LAB_0014b7da;
    lVar18 = lVar18 + 1;
    if (lVar18 == 8) {
      uVar13 = 8;
      while( true ) {
        if (sStack_4e4.v[uVar13] < sStack_508.v[uVar13]) {
          return;
        }
        if (sStack_508.v[uVar13] < sStack_4e4.v[uVar13]) break;
        bVar70 = uVar13 == 0;
        uVar13 = uVar13 - 1;
        if (bVar70) {
          return;
        }
      }
      return;
    }
  }
  pcStack_510 = (code *)0x14b7da;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_0014b7da:
  pcStack_510 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar14 = (int)a_01;
  piStack_538 = piVar35;
  uStack_530 = uVar49;
  psStack_528 = (secp256k1_modinv64_modinfo *)pcVar62;
  psStack_518 = psVar57;
  pcStack_510 = (code *)uVar50;
  if (iVar14 < 1) {
    psStack_548 = (secp256k1_modinv32_signed30 *)0x14b8cd;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014b8cd:
    iVar22 = (int)piVar55;
    psStack_548 = (secp256k1_modinv32_signed30 *)0x14b8d2;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar21 = piVar55[1];
    iVar52 = *piVar55;
    piVar35 = (int *)(long)psVar39->v[0];
    uVar38 = (long)*extraout_RDX * (long)iVar21 + (long)piVar35 * (long)iVar52;
    if ((uVar38 & 0x3fffffff) != 0) goto LAB_0014b8cd;
    iVar4 = piVar55[3];
    iVar22 = piVar55[2];
    piVar35 = (int *)((long)piVar35 * (long)iVar22);
    piVar55 = (int *)((long)*extraout_RDX * (long)iVar4 + (long)piVar35);
    if (((ulong)piVar55 & 0x3fffffff) == 0) {
      lVar31 = (long)piVar55 >> 0x1e;
      lVar18 = (long)uVar38 >> 0x1e;
      if (iVar14 != 1) {
        uVar49 = 1;
        do {
          lVar18 = (long)extraout_RDX[uVar49] * (long)iVar21 +
                   (long)psVar39->v[uVar49] * (long)iVar52 + lVar18;
          lVar31 = (long)extraout_RDX[uVar49] * (long)iVar4 +
                   (long)psVar39->v[uVar49] * (long)iVar22 + lVar31;
          psVar39->v[uVar49 - 1] = (uint)lVar18 & 0x3fffffff;
          extraout_RDX[uVar49 - 1] = (uint)lVar31 & 0x3fffffff;
          uVar49 = uVar49 + 1;
          lVar31 = lVar31 >> 0x1e;
          lVar18 = lVar18 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar49);
      }
      psVar39->v[(long)iVar14 + -1] = (int32_t)lVar18;
      extraout_RDX[(long)iVar14 + -1] = (int)lVar31;
      return;
    }
  }
  psStack_548 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar18 = 0;
  psStack_548 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar18 < extraout_EDX) {
      psStack_548 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_548->v + (long)psVar39->v[lVar18] * (long)iVar22);
    }
    a_01->v[lVar18] = (uint)psStack_548 & 0x3fffffff;
    psStack_548 = (secp256k1_modinv32_signed30 *)((long)psStack_548 >> 0x1e);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 8);
  if (8 < extraout_EDX) {
    psStack_548 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_548->v + (long)psVar39->v[8] * (long)iVar22);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_548;
  if (b == psStack_548) {
    a_01->v[8] = (int)psStack_548;
    return;
  }
  pcStack_550 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar13 = *extraout_RDX_00;
  psVar64 = (secp256k1_modinv32_signed30 *)(long)(int)uVar13;
  uVar60 = extraout_RDX_00[1];
  lVar18 = (long)(int)uVar60;
  uVar42 = extraout_RDX_00[2];
  psVar36 = (secp256k1_modinv32_signed30 *)(long)(int)uVar42;
  lStack_588 = (long)(int)extraout_RDX_00[3];
  psVar40 = (secp256k1_fe *)0x9;
  pcStack_598 = (code *)0x14b96c;
  a_02 = a_01;
  piStack_578 = piVar35;
  uStack_570 = uVar49;
  psStack_568 = (secp256k1_modinv64_modinfo *)pcVar62;
  psStack_558 = psVar57;
  pcStack_550 = (code *)uVar50;
  iVar14 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar14 < 1) {
    pcStack_598 = (code *)0x14bbd4;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014bbd4:
    pcStack_598 = (code *)0x14bbd9;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014bbd9:
    pcStack_598 = (code *)0x14bbde;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014bbde:
    pcStack_598 = (code *)0x14bbe3;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014bbe3:
    pcStack_598 = (code *)0x14bbe8;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014bbe8:
    pcStack_598 = (code *)0x14bbed;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014bbed:
    pcStack_598 = (code *)0x14bbf2;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014bbf2:
    pcStack_598 = (code *)0x14bbf7;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar59 = b;
LAB_0014bbf7:
    pcStack_598 = (code *)0x14bbfc;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014bbfc:
    pcStack_598 = (code *)0x14bc01;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014bc01:
    pcStack_598 = (code *)0x14bc06;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar40 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x14b989;
    a_02 = a_01;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar14) goto LAB_0014bbd4;
    psVar40 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x14b9a6;
    a_02 = psVar39;
    iVar14 = secp256k1_modinv32_mul_cmp_30(psVar39,9,b,-2);
    if (iVar14 < 1) goto LAB_0014bbd9;
    psVar40 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x14b9c3;
    a_02 = psVar39;
    iVar14 = secp256k1_modinv32_mul_cmp_30(psVar39,9,b,1);
    if (-1 < iVar14) goto LAB_0014bbde;
    psVar59 = (secp256k1_modinv32_signed30 *)-(long)psVar64;
    if (0 < (long)psVar64) {
      psVar59 = psVar64;
    }
    lVar31 = -lVar18;
    if (lVar18 < 1) {
      lVar31 = lVar18;
    }
    if (lVar31 + 0x40000000 < (long)psVar59) goto LAB_0014bbe3;
    psVar59 = (secp256k1_modinv32_signed30 *)-(long)psVar36;
    if (0 < (long)psVar36) {
      psVar59 = psVar36;
    }
    lVar31 = -lStack_588;
    if (lStack_588 < 1) {
      lVar31 = lStack_588;
    }
    if (lVar31 + 0x40000000 < (long)psVar59) goto LAB_0014bbe8;
    uVar56 = a_01->v[8] >> 0x1f;
    uVar15 = psVar39->v[8] >> 0x1f;
    psVar40 = (secp256k1_fe *)(ulong)uVar15;
    iVar14 = (uVar15 & uVar60) + (uVar56 & uVar13);
    a_02 = (secp256k1_modinv32_signed30 *)
           (psVar39->v[0] * lVar18 + (long)a_01->v[0] * (long)psVar64);
    lVar31 = (long)(int)(iVar14 - ((int)a_02 * b[1].v[0] + iVar14 & 0x3fffffffU));
    piVar25 = (int32_t *)((long)a_02->v + lVar31 * b->v[0]);
    if (((ulong)piVar25 & 0x3fffffff) != 0) goto LAB_0014bbed;
    lStack_580 = lVar31;
    iVar14 = (uVar15 & (uint)lStack_588) + (uVar56 & uVar42);
    lVar24 = psVar39->v[0] * lStack_588 + (long)a_01->v[0] * (long)psVar36;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar13 = iVar14 - (b[1].v[0] * (int)lVar24 + iVar14 & 0x3fffffffU);
    psVar40 = (secp256k1_fe *)(ulong)uVar13;
    uVar49 = (long)b->v[0] * (long)(int)uVar13 + lVar24;
    if ((uVar49 & 0x3fffffff) != 0) goto LAB_0014bbf2;
    lVar24 = (long)uVar49 >> 0x1e;
    lVar26 = (long)piVar25 >> 0x1e;
    lVar46 = 1;
    do {
      lVar26 = b->v[lVar46] * lVar31 + psVar39->v[lVar46] * lVar18 +
               (long)a_01->v[lVar46] * (long)psVar64 + lVar26;
      psVar59 = (secp256k1_modinv32_signed30 *)(psVar39->v[lVar46] * lStack_588);
      lVar24 = (long)psVar59->v +
               (long)a_01->v[lVar46] * (long)psVar36 + lVar24 +
               (long)b->v[lVar46] * (long)(int)uVar13;
      a_01->v[lVar46 + -1] = (uint)lVar26 & 0x3fffffff;
      psVar39->v[lVar46 + -1] = (uint)lVar24 & 0x3fffffff;
      lVar46 = lVar46 + 1;
      lVar24 = lVar24 >> 0x1e;
      lVar26 = lVar26 >> 0x1e;
    } while (lVar46 != 9);
    a_01->v[8] = (int32_t)lVar26;
    psVar39->v[8] = (int32_t)lVar24;
    psVar40 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x14bb6d;
    a_02 = a_01;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar36 = psVar39;
    psVar64 = b;
    if (iVar14 < 1) goto LAB_0014bbf7;
    psVar40 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x14bb8a;
    a_02 = a_01;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar14) goto LAB_0014bbfc;
    psVar40 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x14bba3;
    a_02 = psVar39;
    iVar14 = secp256k1_modinv32_mul_cmp_30(psVar39,9,b,-2);
    if (iVar14 < 1) goto LAB_0014bc01;
    psVar40 = (secp256k1_fe *)0x9;
    pcStack_598 = (code *)0x14bbbc;
    a_02 = psVar39;
    iVar14 = secp256k1_modinv32_mul_cmp_30(psVar39,9,b,1);
    if (iVar14 < 0) {
      return;
    }
  }
  pcStack_598 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_598 = (code *)lVar18;
  psStack_5a0 = a_01;
  psStack_5a8 = psVar39;
  psStack_5b0 = psVar64;
  psStack_5b8 = psVar59;
  psStack_5c0 = psVar36;
  uVar13 = a_02->v[0];
  uVar41 = (ulong)uVar13;
  uVar60 = a_02->v[3];
  uVar53 = (ulong)uVar60;
  uVar42 = a_02->v[4];
  uVar38 = (ulong)uVar42;
  uVar15 = a_02->v[5];
  uVar50 = (ulong)uVar15;
  psVar39 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar56 = a_02->v[7];
  uVar49 = (ulong)uVar56;
  iStack_5c4 = a_02->v[8];
  lVar18 = 0;
  do {
    if (a_02->v[lVar18] < -0x3fffffff) {
      pcStack_600 = (code *)0x14bf54;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014bf54:
      pcStack_600 = (code *)0x14bf59;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014bf59;
    }
    if (0x3fffffff < a_02->v[lVar18]) goto LAB_0014bf54;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 9);
  uStack_5e4 = (uint)psVar40;
  psVar40 = (secp256k1_fe *)0x9;
  pcStack_600 = (code *)0x14bc91;
  psVar39 = a_02;
  uStack_5f0 = a_02->v[1];
  uStack_5ec = a_02->v[2];
  uStack_5e8 = a_02->v[6];
  psStack_5e0 = b_00;
  iVar14 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar14 < 1) {
LAB_0014bf59:
    pcStack_600 = (code *)0x14bf5e;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014bf5e:
    pcStack_600 = (code *)0x14bf63;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014bf63:
    pcStack_600 = (code *)0x14bf68;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014bf68:
    pcStack_600 = (code *)0x14bf6d;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar40 = (secp256k1_fe *)0x9;
    pcStack_600 = (code *)0x14bcb0;
    psVar39 = a_02;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_5e0,1);
    if (-1 < iVar14) goto LAB_0014bf5e;
    uVar20 = iStack_5c4 >> 0x1f;
    uStack_5c8 = psStack_5e0->v[1];
    uVar61 = (uVar20 & uStack_5c8) + uStack_5f0;
    uStack_5f0 = psStack_5e0->v[2];
    uVar28 = (uVar20 & uStack_5f0) + uStack_5ec;
    uStack_5ec = psStack_5e0->v[3];
    uStack_5cc = psStack_5e0->v[4];
    uStack_5d0 = psStack_5e0->v[5];
    uStack_5d4 = psStack_5e0->v[6];
    uVar29 = (uVar20 & uStack_5d4) + uStack_5e8;
    uStack_5e8 = psStack_5e0->v[7];
    uStack_5f4 = (int)uStack_5e4 >> 0x1f;
    uStack_5e4 = psStack_5e0->v[8];
    uVar67 = ((uVar20 & psStack_5e0->v[0]) + uVar13 ^ uStack_5f4) - uStack_5f4;
    uVar43 = ((int)uVar67 >> 0x1e) + ((uVar61 ^ uStack_5f4) - uStack_5f4);
    uVar61 = ((int)uVar43 >> 0x1e) + ((uVar28 ^ uStack_5f4) - uStack_5f4);
    uVar68 = ((int)uVar61 >> 0x1e) + (((uVar20 & uStack_5ec) + uVar60 ^ uStack_5f4) - uStack_5f4);
    uVar60 = ((int)uVar68 >> 0x1e) + (((uVar20 & uStack_5cc) + uVar42 ^ uStack_5f4) - uStack_5f4);
    uVar13 = ((int)uVar60 >> 0x1e) + (((uVar20 & uStack_5d0) + uVar15 ^ uStack_5f4) - uStack_5f4);
    uVar42 = ((int)uVar13 >> 0x1e) + ((uVar29 ^ uStack_5f4) - uStack_5f4);
    uVar15 = ((int)uVar42 >> 0x1e) + (((uVar20 & uStack_5e8) + uVar56 ^ uStack_5f4) - uStack_5f4);
    uVar65 = ((int)uVar15 >> 0x1e) +
             (((uVar20 & uStack_5e4) + iStack_5c4 ^ uStack_5f4) - uStack_5f4);
    uVar50 = (ulong)uVar65;
    uStack_5f8 = (int)uVar65 >> 0x1f;
    uVar29 = (psStack_5e0->v[0] & uStack_5f8) + (uVar67 & 0x3fffffff);
    uVar28 = (uStack_5d0 & uStack_5f8) + (uVar13 & 0x3fffffff);
    uVar41 = (ulong)uVar28;
    uVar67 = (uStack_5d4 & uStack_5f8) + (uVar42 & 0x3fffffff);
    uVar53 = (ulong)uVar67;
    uVar13 = ((int)uVar29 >> 0x1e) + (uStack_5c8 & uStack_5f8) + (uVar43 & 0x3fffffff);
    uVar42 = ((int)uVar13 >> 0x1e) + (uStack_5f0 & uStack_5f8) + (uVar61 & 0x3fffffff);
    uVar56 = ((int)uVar42 >> 0x1e) + (uStack_5ec & uStack_5f8) + (uVar68 & 0x3fffffff);
    uVar20 = ((int)uVar56 >> 0x1e) + (uStack_5cc & uStack_5f8) + (uVar60 & 0x3fffffff);
    uVar28 = ((int)uVar20 >> 0x1e) + uVar28;
    uVar67 = ((int)uVar28 >> 0x1e) + uVar67;
    uVar60 = ((int)uVar67 >> 0x1e) + (uStack_5e8 & uStack_5f8) + (uVar15 & 0x3fffffff);
    uVar15 = ((int)uVar60 >> 0x1e) + (uStack_5e4 & uStack_5f8) + uVar65;
    uVar38 = (ulong)uVar15;
    uVar56 = uVar56 & 0x3fffffff;
    psVar40 = (secp256k1_fe *)(ulong)uVar56;
    uVar20 = uVar20 & 0x3fffffff;
    psVar39 = (secp256k1_modinv32_signed30 *)(ulong)uVar20;
    uVar60 = uVar60 & 0x3fffffff;
    uVar49 = (ulong)uVar60;
    a_02->v[0] = uVar29 & 0x3fffffff;
    a_02->v[1] = uVar13 & 0x3fffffff;
    a_02->v[2] = uVar42 & 0x3fffffff;
    a_02->v[3] = uVar56;
    a_02->v[4] = uVar20;
    a_02->v[5] = uVar28 & 0x3fffffff;
    a_02->v[6] = uVar67 & 0x3fffffff;
    a_02->v[7] = uVar60;
    a_02->v[8] = uVar15;
    if (0x3fffffff < uVar15) goto LAB_0014bf63;
    psVar40 = (secp256k1_fe *)0x9;
    pcStack_600 = (code *)0x14bf21;
    psVar39 = a_02;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_5e0,0);
    if (iVar14 < 0) goto LAB_0014bf68;
    psVar40 = (secp256k1_fe *)0x9;
    pcStack_600 = (code *)0x14bf3c;
    psVar39 = a_02;
    iVar14 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_5e0,1);
    if (iVar14 < 0) {
      return;
    }
  }
  pcStack_600 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_698 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_698 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_6e8 = (code *)0x14bfa9;
  uStack_628 = uVar49;
  uStack_620 = uVar50;
  uStack_618 = uVar53;
  psStack_610 = a_02;
  uStack_608 = uVar41;
  pcStack_600 = (code *)uVar38;
  (*(code *)psStack_698)(&sStack_6d0);
  if (psVar39 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar39->v + 8) = sStack_6d0.n[4];
    *(ulong *)(psVar39[1].v + 1) = CONCAT44(sStack_6d0.normalized,sStack_6d0.magnitude);
    *(uint64_t *)(psVar39->v + 4) = sStack_6d0.n[2];
    *(uint64_t *)(psVar39->v + 6) = sStack_6d0.n[3];
    *(uint64_t *)psVar39->v = sStack_6d0.n[0];
    *(uint64_t *)(psVar39->v + 2) = sStack_6d0.n[1];
  }
  uVar69 = 0xfffffffffffff;
  uVar17 = 0xf000000000000;
  uVar38 = 0xffffffffffff;
  uVar50 = 0x1000003d0;
  sStack_660.n[0] = psVar40->n[0];
  sStack_660.n[1] = psVar40->n[1];
  sStack_660.n[2] = psVar40->n[2];
  sStack_660.n[3] = psVar40->n[3];
  sStack_660.n[4] = psVar40->n[4];
  sStack_660.magnitude = psVar40->magnitude;
  sStack_660.normalized = psVar40->normalized;
  a_03 = &sStack_660;
  pcStack_6e8 = (code *)0x14c020;
  secp256k1_fe_verify(a_03);
  lStack_6d8 = 0x1000003d1;
  uVar49 = (sStack_660.n[4] >> 0x30) * 0x1000003d1 + sStack_660.n[0];
  if (((uVar49 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar49 & 0xfffffffffffff) == 0)) {
    uVar53 = (uVar49 >> 0x34) + sStack_660.n[1];
    uVar41 = (uVar53 >> 0x34) + sStack_660.n[2];
    uVar47 = (uVar41 >> 0x34) + sStack_660.n[3];
    uVar51 = (uVar47 >> 0x34) + (sStack_660.n[4] & 0xffffffffffff);
    if ((((uVar53 | uVar49 | uVar41 | uVar47) & 0xfffffffffffff) != 0 || uVar51 != 0) &&
       (((uVar49 | 0x1000003d0) & uVar53 & uVar41 & uVar47 & (uVar51 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c0c3;
LAB_0014c4d7:
    psVar40 = &sStack_6d0;
    pcStack_6e8 = (code *)0x14c4e4;
    secp256k1_fe_verify(psVar40);
    uVar38 = uVar38 & sStack_6d0.n[4];
    uVar49 = (sStack_6d0.n[4] >> 0x30) * lStack_6d8 + sStack_6d0.n[0];
    uVar53 = (uVar49 >> 0x34) + sStack_6d0.n[1];
    uVar41 = (uVar53 >> 0x34) + sStack_6d0.n[2];
    r = (secp256k1_fe *)((uVar41 >> 0x34) + sStack_6d0.n[3]);
    uVar47 = ((ulong)r >> 0x34) + uVar38;
    if ((((uVar53 | uVar49 | uVar41 | (ulong)r) & uVar69) == 0 && uVar47 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar47 ^ uVar17),
       ((uVar49 ^ uVar50) & uVar53 & uVar41 & (ulong)r & (ulong)r_00) == uVar69)) {
      return;
    }
  }
  else {
LAB_0014c0c3:
    pcStack_6e8 = (code *)0x14c0db;
    r = psVar40;
    secp256k1_fe_mul(&sStack_660,psVar40,&sStack_6d0);
    pcStack_6e8 = (code *)0x14c0e3;
    secp256k1_fe_verify(&sStack_660);
    r_00 = &fe_minus_one;
    pcStack_6e8 = (code *)0x14c0ef;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_660.magnitude < 0x20) {
      sStack_660.n[0] = sStack_660.n[0] + 0xffffefffffc2e;
      sStack_660.n[1] = sStack_660.n[1] + 0xfffffffffffff;
      sStack_660.n[2] = sStack_660.n[2] + 0xfffffffffffff;
      sStack_660.n[3] = sStack_660.n[3] + 0xfffffffffffff;
      sStack_660.n[4] = sStack_660.n[4] + 0xffffffffffff;
      sStack_660.normalized = 0;
      sStack_660.magnitude = sStack_660.magnitude + 1;
      pcStack_6e8 = (code *)0x14c144;
      secp256k1_fe_verify(&sStack_660);
      pcStack_6e8 = (code *)0x14c14c;
      secp256k1_fe_verify(&sStack_660);
      uVar49 = (sStack_660.n[4] >> 0x30) * lStack_6d8 + sStack_660.n[0];
      uVar38 = (uVar49 >> 0x34) + sStack_660.n[1];
      uVar53 = (uVar38 >> 0x34) + sStack_660.n[2];
      r = (secp256k1_fe *)((uVar53 >> 0x34) + sStack_660.n[3]);
      uVar41 = ((ulong)r >> 0x34) + (sStack_660.n[4] & 0xffffffffffff);
      if ((((uVar38 | uVar49 | uVar53 | (ulong)r) & 0xfffffffffffff) != 0 || uVar41 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar41 ^ 0xf000000000000),
         ((uVar49 ^ 0x1000003d0) & uVar38 & uVar53 & (ulong)r & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_0014c565;
      sStack_690.n[0] = psVar40->n[0];
      sStack_690.n[1] = psVar40->n[1];
      sStack_690.n[2] = psVar40->n[2];
      sStack_690.n[3] = psVar40->n[3];
      sStack_690.n[4] = psVar40->n[4];
      sStack_690.magnitude = psVar40->magnitude;
      sStack_690.normalized = psVar40->normalized;
      psVar40 = &sStack_690;
      pcStack_6e8 = (code *)0x14c1e4;
      secp256k1_fe_verify(psVar40);
      r_00 = &fe_minus_one;
      pcStack_6e8 = (code *)0x14c1f0;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_690.magnitude) goto LAB_0014c56a;
      uVar37 = sStack_690.n[0] + 0xffffefffffc2e;
      uVar66 = sStack_690.n[1] + 0xfffffffffffff;
      uVar69 = sStack_690.n[2] + 0xfffffffffffff;
      uVar17 = sStack_690.n[3] + 0xfffffffffffff;
      uVar50 = sStack_690.n[4] + 0xffffffffffff;
      sStack_690.normalized = 0;
      sStack_690.magnitude = sStack_690.magnitude + 1;
      pcStack_6e8 = (code *)0x14c265;
      sStack_690.n[0] = uVar37;
      sStack_690.n[1] = uVar66;
      sStack_690.n[2] = uVar69;
      sStack_690.n[3] = uVar17;
      sStack_690.n[4] = uVar50;
      secp256k1_fe_verify(&sStack_690);
      pcStack_6e8 = (code *)0x14c26d;
      secp256k1_fe_verify(&sStack_690);
      a_03 = psStack_698;
      uVar49 = (uVar50 >> 0x30) * lStack_6d8 + uVar37;
      if (((uVar49 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar49 & 0xfffffffffffff) == 0)) {
        uVar50 = uVar50 & 0xffffffffffff;
        uVar47 = uVar66 + (uVar49 >> 0x34);
        uVar38 = (uVar47 >> 0x34) + uVar69;
        uVar53 = (uVar38 >> 0x34) + uVar17;
        uVar41 = (uVar53 >> 0x34) + uVar50;
        if (((uVar47 | uVar49 | uVar38 | uVar53) & 0xfffffffffffff) == 0 && uVar41 == 0) {
          return;
        }
        if (((uVar49 | 0x1000003d0) & uVar47 & uVar38 & uVar53 & (uVar41 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      r = &sStack_690;
      pcStack_6e8 = (code *)0x14c32d;
      (*(code *)psStack_698)();
      psVar40 = &sStack_6d0;
      pcStack_6e8 = (code *)0x14c33a;
      secp256k1_fe_verify(psVar40);
      r_00 = &fe_minus_one;
      pcStack_6e8 = (code *)0x14c346;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_6d0.magnitude) goto LAB_0014c56f;
      psVar40 = &sStack_6d0;
      sStack_6d0.n[0] = sStack_6d0.n[0] + 0xffffefffffc2e;
      sStack_6d0.n[1] = sStack_6d0.n[1] + 0xfffffffffffff;
      sStack_6d0.n[2] = sStack_6d0.n[2] + 0xfffffffffffff;
      sStack_6d0.n[3] = sStack_6d0.n[3] + 0xfffffffffffff;
      sStack_6d0.n[4] = sStack_6d0.n[4] + 0xffffffffffff;
      sStack_6d0.magnitude = sStack_6d0.magnitude + 1;
      uVar38 = 0;
      sStack_6d0.normalized = 0;
      pcStack_6e8 = (code *)0x14c38f;
      secp256k1_fe_verify(psVar40);
      pcStack_6e8 = (code *)0x14c398;
      r = psVar40;
      (*(code *)a_03)(psVar40);
      pcStack_6e8 = (code *)0x14c3a0;
      secp256k1_fe_verify(psVar40);
      sStack_6d0.n[0] = sStack_6d0.n[0] + 1;
      sStack_6d0.magnitude = sStack_6d0.magnitude + 1;
      sStack_6d0.normalized = 0;
      pcStack_6e8 = (code *)0x14c3b1;
      secp256k1_fe_verify(psVar40);
      pcStack_6e8 = (code *)0x14c3b9;
      secp256k1_fe_verify(psVar40);
      a_03 = &sStack_690;
      pcStack_6e8 = (code *)0x14c3c6;
      r_00 = a_03;
      secp256k1_fe_verify(a_03);
      if (sStack_690.magnitude + sStack_6d0.magnitude < 0x21) {
        sStack_6d0.n[0] = sStack_6d0.n[0] + sStack_690.n[0];
        sStack_6d0.n[1] = sStack_6d0.n[1] + sStack_690.n[1];
        sStack_6d0.n[2] = sStack_6d0.n[2] + sStack_690.n[2];
        sStack_6d0.n[3] = sStack_6d0.n[3] + sStack_690.n[3];
        sStack_6d0.n[4] = sStack_6d0.n[4] + sStack_690.n[4];
        sStack_6d0.normalized = 0;
        pcStack_6e8 = (code *)0x14c414;
        sStack_6d0.magnitude = sStack_690.magnitude + sStack_6d0.magnitude;
        secp256k1_fe_verify(&sStack_6d0);
        pcStack_6e8 = (code *)0x14c41c;
        secp256k1_fe_verify(&sStack_6d0);
        uVar49 = (sStack_6d0.n[4] >> 0x30) * lStack_6d8 + sStack_6d0.n[0];
        if (((uVar49 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar49 & 0xfffffffffffff) == 0)) {
          uVar53 = (uVar49 >> 0x34) + sStack_6d0.n[1];
          uVar41 = (uVar53 >> 0x34) + sStack_6d0.n[2];
          uVar47 = (uVar41 >> 0x34) + sStack_6d0.n[3];
          uVar51 = (uVar47 >> 0x34) + (sStack_6d0.n[4] & 0xffffffffffff);
          if (((uVar53 | uVar49 | uVar41 | uVar47) & 0xfffffffffffff) == 0 && uVar51 == 0) {
            return;
          }
          if (((uVar49 | 0x1000003d0) & uVar53 & uVar41 & uVar47 & (uVar51 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_6e8 = (code *)0x14c4d7;
        test_inverse_field_cold_2();
        goto LAB_0014c4d7;
      }
    }
    else {
      pcStack_6e8 = (code *)0x14c565;
      test_inverse_field_cold_7();
LAB_0014c565:
      pcStack_6e8 = (code *)0x14c56a;
      test_inverse_field_cold_6();
LAB_0014c56a:
      a_03 = &sStack_660;
      pcStack_6e8 = (code *)0x14c56f;
      test_inverse_field_cold_5();
LAB_0014c56f:
      uVar38 = 0xffffffffffff;
      pcStack_6e8 = (code *)0x14c574;
      test_inverse_field_cold_4();
    }
    pcStack_6e8 = (code *)0x14c579;
    test_inverse_field_cold_3();
  }
  pcStack_6e8 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar48 = (secp256k1_fe *)auStack_758;
  pcVar62 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar62 = secp256k1_scalar_inverse;
  }
  pcStack_760 = (code *)0x14c5a7;
  auStack_718._32_8_ = psVar40;
  auStack_718._40_8_ = a_03;
  pcStack_6e8 = (code *)uVar69;
  (*pcVar62)(auStack_758);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_758._20_4_,auStack_758._16_4_);
    r_00->n[3] = CONCAT44(auStack_758._28_4_,auStack_758._24_4_);
    r_00->n[0] = CONCAT44(auStack_758._4_4_,auStack_758._0_4_);
    r_00->n[1] = CONCAT44(auStack_758._12_4_,auStack_758._8_4_);
  }
  pcStack_760 = (code *)0x14c5c6;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar71._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar71._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar71._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar71._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar14 = movmskps(extraout_EAX,auVar71);
  if (iVar14 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_718;
    pcStack_760 = (code *)0x14c5fa;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_758);
    pcStack_760 = (code *)0x14c602;
    psVar40 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_718._0_8_ != 1 || auStack_718._8_8_ != 0) || auStack_718._16_8_ != 0) ||
        auStack_718._24_8_ != 0) {
      pcStack_760 = (code *)0x14c70c;
      test_inverse_scalar_cold_1();
      goto LAB_0014c70c;
    }
    pcStack_760 = (code *)0x14c632;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_758 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_760 = (code *)0x14c63a;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_758 + 0x20));
    auVar72._0_4_ = -(uint)(iStack_728 == 0 && auStack_758._32_4_ == 0);
    auVar72._4_4_ = -(uint)(iStack_724 == 0 && iStack_734 == 0);
    auVar72._8_4_ = -(uint)(iStack_720 == 0 && iStack_730 == 0);
    auVar72._12_4_ = -(uint)(iStack_71c == 0 && iStack_72c == 0);
    iVar14 = movmskps(extraout_EAX_00,auVar72);
    if (iVar14 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_758 + 0x20);
    pcStack_760 = (code *)0x14c66b;
    (*pcVar62)(a,a);
    pcStack_760 = (code *)0x14c680;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_758,&scalar_minus_one,(secp256k1_scalar *)auStack_758);
    pcStack_760 = (code *)0x14c689;
    (*pcVar62)(auStack_758,auStack_758);
    pcStack_760 = (code *)0x14c69b;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_758,(secp256k1_scalar *)auStack_758,&secp256k1_scalar_one
              );
    pcStack_760 = (code *)0x14c6a9;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_758,a,(secp256k1_scalar *)auStack_758);
    pcStack_760 = (code *)0x14c6b1;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_758);
    auVar73._0_4_ = -(uint)(auStack_758._16_4_ == 0 && auStack_758._0_4_ == 0);
    auVar73._4_4_ = -(uint)(auStack_758._20_4_ == 0 && auStack_758._4_4_ == 0);
    auVar73._8_4_ = -(uint)(auStack_758._24_4_ == 0 && auStack_758._8_4_ == 0);
    auVar73._12_4_ = -(uint)(auStack_758._28_4_ == 0 && auStack_758._12_4_ == 0);
    iVar14 = movmskps(extraout_EAX_01,auVar73);
    if (iVar14 == 0xf) {
      return;
    }
    pcStack_760 = (code *)0x14c6d5;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_758;
  }
  pcStack_760 = (code *)0x14c6e0;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_758);
  auVar74._0_4_ = -(uint)(auStack_758._16_4_ == 0 && auStack_758._0_4_ == 0);
  auVar74._4_4_ = -(uint)(auStack_758._20_4_ == 0 && auStack_758._4_4_ == 0);
  auVar74._8_4_ = -(uint)(auStack_758._24_4_ == 0 && auStack_758._8_4_ == 0);
  auVar74._12_4_ = -(uint)(auStack_758._28_4_ == 0 && auStack_758._12_4_ == 0);
  iVar14 = movmskps(extraout_EAX_02,auVar74);
  r = (secp256k1_fe *)auStack_758;
  psVar40 = psVar48;
  if (iVar14 == 0xf) {
    return;
  }
LAB_0014c70c:
  pcStack_760 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1810;
  psStack_788 = r;
  uStack_780 = uVar50;
  uStack_778 = uVar17;
  psStack_770 = r_00;
  pcStack_768 = pcVar62;
  pcStack_760 = (code *)uVar38;
  memset(__s,0,0x1081);
  uStack_1820 = 0;
  lVar18 = 0x41;
  psStack_1818 = psVar40;
  secp256k1_hsort(__s,0x41,(size_t)psVar40,test_hsort_cmp,&uStack_1820);
  if (0x3f < uStack_1820) {
    test_hsort_is_sorted(auStack_1810,0x41,(size_t)psVar40);
    if (0 < COUNT) {
      iVar14 = 0;
      do {
        uVar16 = testrand_int(0x41);
        count = (size_t)(int)uVar16;
        testrand_bytes_test(auStack_1810,count * (long)psVar40);
        secp256k1_hsort(auStack_1810,count,(size_t)psVar40,test_hsort_cmp,&uStack_1820);
        test_hsort_is_sorted(auStack_1810,count,(size_t)psVar40);
        iVar14 = iVar14 + 1;
      } while (iVar14 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar31 = 0;
    do {
      if (__s[lVar31] != *(uchar *)(lVar18 + lVar31)) {
        return;
      }
      lVar31 = lVar31 + 1;
    } while (extraout_RDX_01[1] != lVar31);
  }
  return;
LAB_0014a328:
  pcStack_f0 = (code *)0x14a32d;
  test_modinv32_uint16_cold_5();
LAB_0014a32d:
  pcStack_f0 = (code *)0x14a332;
  test_modinv32_uint16_cold_3();
LAB_0014a332:
  pcStack_f0 = (code *)0x14a337;
  test_modinv32_uint16_cold_1();
  psVar63 = psVar57;
LAB_0014a337:
  psVar45 = psVar63;
  pcStack_f0 = (code *)0x14a33c;
  test_modinv32_uint16_cold_6();
  goto LAB_0014a33c;
LAB_0014a883:
  pcStack_1d8 = (code *)0x14a888;
  test_modinv64_uint16_cold_5();
  goto LAB_0014a888;
}

Assistant:

static void test_modinv32_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    uint16_t tmp[16];
    secp256k1_modinv32_signed30 x;
    secp256k1_modinv32_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed30(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4] | x.v[5] | x.v[6] | x.v[7] | x.v[8]) != 0;
    uint16_to_signed30(&m.modulus, mod);

    /* compute 1/modulus mod 2^30 */
    m.modulus_inv30 = modinv2p64(m.modulus.v[0]) & 0x3fffffff;
    CHECK(((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1);

    /* Test secp256k1_jacobi32_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed30(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed30(&x, sqr);
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed30(&x, in);
    mutate_sign_signed30(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* produce output */
        signed30_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* check if the result is equal to the input */
        signed30_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}